

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forward_int8_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  undefined1 uVar11;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined4 uVar12;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar31;
  undefined1 uVar32;
  char cVar33;
  char cVar34;
  float fVar35;
  _func_int *p_Var36;
  Layer *pLVar37;
  undefined1 auVar38 [14];
  undefined1 auVar39 [12];
  unkbyte10 Var40;
  undefined1 auVar41 [14];
  undefined1 auVar42 [12];
  unkbyte10 Var43;
  undefined1 auVar44 [14];
  undefined1 auVar45 [12];
  unkbyte10 Var46;
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [14];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [14];
  undefined1 auVar55 [12];
  undefined1 auVar56 [14];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  unkbyte10 Var59;
  size_t sVar60;
  Allocator *pAVar61;
  void *pvVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  pointer pfVar65;
  pointer pfVar66;
  byte bVar67;
  undefined1 uVar68;
  int i;
  int iVar69;
  int iVar70;
  long lVar71;
  Mat *this_00;
  ulong uVar72;
  _func_int **pp_Var73;
  int iVar74;
  uint uVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  ulong uVar81;
  ulong uVar82;
  long lVar83;
  int iVar84;
  uint uVar85;
  ulong uVar86;
  float *pfVar87;
  long lVar88;
  int n_1;
  int iVar89;
  uint uVar90;
  int iVar91;
  int iVar92;
  int q_3;
  int iVar93;
  long lVar94;
  int iVar95;
  long lVar96;
  long lVar97;
  _Vector_base<float,_std::allocator<float>_> *this_01;
  long lVar98;
  undefined8 *puVar99;
  int i_1;
  uint uVar100;
  long lVar101;
  undefined8 *puVar102;
  int n_9;
  long lVar103;
  int iVar104;
  int p_4;
  long lVar105;
  float *pfVar106;
  undefined1 *puVar107;
  uint uVar108;
  ulong uVar109;
  void *pvVar110;
  float *pfVar111;
  uint uVar112;
  int iVar113;
  int iVar114;
  ulong uVar115;
  float *pfVar116;
  int q;
  int iVar117;
  int iVar118;
  ulong uVar119;
  char *pcVar120;
  bool bVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  char cVar141;
  char cVar142;
  char cVar144;
  char cVar145;
  char cVar146;
  undefined8 uVar127;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  char cVar143;
  undefined1 auVar133 [16];
  short sVar147;
  undefined1 auVar154 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar171;
  undefined1 auVar172 [12];
  short sVar181;
  undefined1 auVar173 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar190 [16];
  short sVar193;
  short sVar194;
  short sVar195;
  short sVar196;
  short sVar197;
  undefined1 auVar191 [12];
  short sVar198;
  short sVar201;
  undefined1 auVar199 [12];
  short sVar203;
  undefined1 auVar202 [12];
  short sVar206;
  undefined1 auVar204 [12];
  undefined1 auVar207 [16];
  undefined1 *local_790;
  undefined1 *local_788;
  undefined1 local_778 [16];
  long local_758;
  undefined1 *local_750;
  long local_738;
  undefined1 local_728 [16];
  long local_710;
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [2] [16];
  int local_6c0;
  Option opt_q;
  int sum0 [4];
  size_t local_638;
  int iStack_61c;
  Mat img;
  Mat kernel_tm;
  Mat bottom_blob_bordered;
  int sum1 [4];
  size_t local_4e8;
  int local_4cc;
  Mat top_blob_int32;
  vector<float,_std::allocator<float>_> requantize_scales;
  int local_41c;
  int sum2 [4];
  size_t local_3e8;
  undefined1 local_3d8 [16];
  int iStack_3cc;
  short t1 [4];
  int local_3a0;
  int local_39c;
  size_t local_398;
  int local_37c;
  int sum3 [4];
  size_t local_348;
  int local_32c;
  short t0 [4];
  int local_300;
  int local_2fc;
  size_t local_2f8;
  int local_2dc;
  short t3 [4];
  undefined8 uStack_2b0;
  short t2 [4];
  undefined8 uStack_270;
  int local_228 [2];
  int o0 [2];
  short w3 [4];
  size_t local_208;
  int local_1ec;
  short w2 [4];
  size_t local_1b8;
  int local_19c;
  _Vector_base<float,_std::allocator<float>_> local_178;
  _Vector_base<float,_std::allocator<float>_> local_160;
  int sum3_2 [16];
  int sum2_2 [16];
  Mat bottom_blob_int8;
  Option opt_b;
  undefined7 uVar14;
  undefined6 uVar16;
  undefined5 uVar18;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined3 uVar25;
  undefined3 uVar26;
  undefined2 uVar29;
  undefined2 uVar30;
  undefined4 uVar122;
  undefined6 uVar126;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar128 [12];
  undefined1 auVar129 [14];
  undefined1 auVar130 [16];
  undefined4 uVar148;
  undefined6 uVar149;
  undefined8 uVar150;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar151 [12];
  undefined1 auVar152 [14];
  undefined1 auVar153 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar180 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar200 [16];
  undefined1 auVar205 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  
  iVar92 = bottom_blob->elempack;
  if (iVar92 == 0) {
    Mat::Mat(&bottom_blob_int8,bottom_blob);
LAB_00164781:
    uVar127._0_1_ = opt->lightmode;
    uVar127._1_3_ = *(undefined3 *)&opt->field_0x1;
    uVar127._4_4_ = opt->num_threads;
    uVar10 = opt->workspace_allocator;
    uVar12 = opt->openmp_blocktime;
    uVar19 = opt->use_winograd_convolution;
    uVar23 = opt->use_sgemm_convolution;
    uVar27 = opt->use_int8_inference;
    uVar31 = opt->use_vulkan_compute;
    uVar29 = CONCAT11(uVar31,uVar27);
    uVar25 = CONCAT21(uVar29,uVar23);
    uVar21 = CONCAT31(uVar25,uVar19);
    auVar131[0] = opt->use_bf16_storage;
    auVar131[1] = opt->use_fp16_packed;
    auVar131[2] = opt->use_fp16_storage;
    auVar131[3] = opt->use_fp16_arithmetic;
    auVar131[4] = opt->use_int8_packed;
    auVar131[5] = opt->use_int8_storage;
    auVar131[6] = opt->use_int8_arithmetic;
    auVar131[7] = opt->use_packing_layout;
    uVar11 = opt->use_shader_pack8;
    uVar13 = opt->use_subgroup_basic;
    uVar15 = opt->use_subgroup_vote;
    uVar17 = opt->use_subgroup_ballot;
    uVar20 = opt->use_subgroup_shuffle;
    uVar24 = opt->use_image_storage;
    uVar28 = opt->use_tensor_storage;
    uVar32 = opt->use_weight_fp16_storage;
    uVar30 = CONCAT11(uVar32,uVar28);
    uVar26 = CONCAT21(uVar30,uVar24);
    uVar22 = CONCAT31(uVar26,uVar20);
    uVar18 = CONCAT41(uVar22,uVar17);
    uVar16 = CONCAT51(uVar18,uVar15);
    uVar14 = CONCAT61(uVar16,uVar13);
    auVar131._8_8_ = CONCAT71(uVar14,uVar11);
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_reserved_1 = opt->use_reserved_1;
    opt_q.use_reserved_2 = opt->use_reserved_2;
    opt_q.use_reserved_3 = opt->use_reserved_3;
    opt_q.use_reserved_4 = opt->use_reserved_4;
    opt_q.use_reserved_5 = opt->use_reserved_5;
    opt_q.use_reserved_6 = opt->use_reserved_6;
    opt_q.use_reserved_7 = opt->use_reserved_7;
    opt_q.use_reserved_8 = opt->use_reserved_8;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q._32_8_ = auVar131._0_8_;
    opt_q._40_4_ = SUB84(auVar131._8_8_,0);
    opt_q._0_4_ = SUB84(uVar127,0);
    opt_q.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_q.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_q.num_threads = uVar127._4_4_;
    opt_q.workspace_allocator = (Allocator *)uVar10;
    opt_q.openmp_blocktime = uVar12;
    opt_q._28_4_ = uVar21;
    opt_q._44_4_ = uVar22;
    quantize_to_int8(bottom_blob,&bottom_blob_int8,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86[-3]),&opt_q);
  }
  else {
    sVar60 = bottom_blob->elemsize;
    Mat::Mat(&bottom_blob_int8,bottom_blob);
    if (((int)sVar60 << 3) / iVar92 != 8) goto LAB_00164781;
  }
  bottom_blob_bordered.cstep = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.elemsize = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.d = 0;
  bottom_blob_bordered.c = 0;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]),
             &bottom_blob_int8,&bottom_blob_bordered,opt);
  iVar91 = bottom_blob_bordered.c;
  iVar80 = bottom_blob_bordered.elempack;
  iVar92 = -100;
  if ((bottom_blob_bordered.data == (void *)0x0) ||
     (bottom_blob_bordered.cstep * (long)bottom_blob_bordered.c == 0)) goto LAB_001667e0;
  p_Var36 = this->_vptr_Convolution_x86[-3];
  iVar89 = (~((*(int *)(p_Var36 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var36 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data)) +
           bottom_blob_bordered.w) /
           *(int *)(p_Var36 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) + 1;
  iVar93 = (~((*(int *)(p_Var36 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) + -1) *
             *(int *)(p_Var36 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data)) +
           bottom_blob_bordered.h) / *(int *)((long)&this->convolution_dilation1 + (long)p_Var36) +
           1;
  bVar67 = (*(uint *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data) & 3) == 0 &
           opt->use_packing_layout;
  uVar112 = (uint)bVar67 + (uint)bVar67 * 2 + 1;
  iVar118 = *(int *)(p_Var36 + 0x18 + (long)&(this->weight_data_int8).data);
  uVar90 = ((uint)bVar67 + (uint)bVar67 * 2) * 4 + 4;
  uVar85 = uVar90;
  if (100 < iVar118) {
    uVar85 = uVar112;
  }
  Mat::create(top_blob,iVar89,iVar93,
              (int)*(uint *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data) /
              (int)uVar112,(ulong)uVar85,uVar112,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_001667e0;
  top_blob_int32.cstep = 0;
  top_blob_int32.data = (void *)0x0;
  top_blob_int32.refcount._0_4_ = 0;
  top_blob_int32.refcount._4_4_ = 0;
  top_blob_int32._16_12_ = SUB1612((undefined1  [16])0x0,4);
  top_blob_int32._32_12_ = SUB1612((undefined1  [16])0x0,0);
  top_blob_int32.w = 0;
  top_blob_int32.h = 0;
  top_blob_int32.d = 0;
  top_blob_int32.c = 0;
  Mat::create(&top_blob_int32,iVar89,iVar93,
              *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                      (long)&(this->weight_data_3x3_winograd63).data) / (int)uVar112,(ulong)uVar90,
              uVar112,opt->workspace_allocator);
  iVar77 = top_blob_int32.c;
  iVar104 = top_blob_int32.h;
  iVar117 = top_blob_int32.w;
  iVar89 = bottom_blob_bordered.c;
  iVar93 = bottom_blob_bordered.w;
  iVar92 = -100;
  if ((top_blob_int32.data != (void *)0x0) && (top_blob_int32.cstep * (long)top_blob_int32.c != 0))
  {
    if (iVar80 == 8 && bVar67 == 1) {
      p_Var36 = this->_vptr_Convolution_x86[-3];
      uVar90 = *(uint *)(p_Var36 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      if ((uVar90 == 1) &&
         (*(int *)(p_Var36 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 1)) {
        if ((*(int *)(p_Var36 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) != 1) ||
           (((*(int *)(p_Var36 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1 ||
             (*(int *)(p_Var36 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) != 1)) ||
            (*(int *)((long)&this->convolution_dilation1 + (long)p_Var36) != 1)))) {
          if ((((*(int *)(p_Var36 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) != 1) ||
               (*(int *)(p_Var36 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1)) ||
              (*(int *)(p_Var36 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) != 2)) ||
             (*(int *)((long)&this->convolution_dilation1 + (long)p_Var36) != 2)) goto LAB_00164c0b;
          opt_q.lightmode = false;
          opt_q._1_3_ = 0;
          opt_q.num_threads = 0;
          opt_q.blob_allocator._0_4_ = 0;
          opt_q.blob_allocator._4_4_ = 0;
          opt_q.workspace_allocator = (Allocator *)0x0;
          opt_q.openmp_blocktime = 0;
          opt_q.use_bf16_storage = false;
          opt_q.use_fp16_packed = false;
          opt_q.use_fp16_storage = false;
          opt_q.use_fp16_arithmetic = false;
          opt_q.use_int8_packed = false;
          opt_q.use_int8_storage = false;
          opt_q.use_int8_arithmetic = false;
          opt_q.use_packing_layout = false;
          opt_q.use_shader_pack8 = false;
          opt_q.use_subgroup_basic = false;
          opt_q.use_subgroup_vote = false;
          opt_q.use_subgroup_ballot = false;
          opt_q.use_subgroup_shuffle = false;
          opt_q.use_image_storage = false;
          opt_q.use_tensor_storage = false;
          opt_q.use_weight_fp16_storage = false;
          opt_q.flush_denormals = 0;
          opt_q.use_local_pool_allocator = false;
          opt_q.use_reserved_1 = false;
          opt_q.use_reserved_2 = false;
          opt_q.use_reserved_3 = false;
          opt_q.use_reserved_4 = false;
          opt_q.use_reserved_5 = false;
          opt_q.use_reserved_6 = false;
          opt_q.use_reserved_7 = false;
          Mat::create((Mat *)&opt_q,top_blob_int32.w,top_blob_int32.h,bottom_blob_bordered.c,
                      bottom_blob_bordered.elemsize,bottom_blob_bordered.elempack,
                      opt->workspace_allocator);
          iVar77 = 0;
          iVar92 = iVar117;
          if (iVar117 < 1) {
            iVar92 = iVar77;
          }
          local_6f8._0_8_ = &this->weight_data_int8;
          if (iVar104 < 1) {
            iVar104 = 0;
          }
          if (iVar89 < 1) {
            iVar89 = iVar77;
          }
          local_728._0_4_ = iVar89;
          for (; iVar77 != iVar89; iVar77 = iVar77 + 1) {
            Mat::channel(&img,&bottom_blob_bordered,iVar77);
            puVar99 = (undefined8 *)CONCAT44(img.data._4_4_,img.data._0_4_);
            Mat::~Mat(&img);
            Mat::channel(&img,(Mat *)&opt_q,iVar77);
            puVar102 = (undefined8 *)CONCAT44(img.data._4_4_,img.data._0_4_);
            Mat::~Mat(&img);
            for (iVar95 = 0; iVar74 = iVar92, iVar95 != iVar104; iVar95 = iVar95 + 1) {
              while (bVar121 = iVar74 != 0, iVar74 = iVar74 + -1, bVar121) {
                *puVar102 = *puVar99;
                puVar99 = puVar99 + 2;
                puVar102 = puVar102 + 1;
              }
              puVar99 = puVar99 + (iVar93 - iVar117) * 2;
            }
          }
          conv1x1s1_sgemm_pack8to4_int8_sse
                    ((Mat *)&opt_q,&top_blob_int32,&this->weight_data_int8,opt);
          goto LAB_00165276;
        }
        conv1x1s1_sgemm_pack8to4_int8_sse
                  (&bottom_blob_bordered,&top_blob_int32,&this->weight_data_int8,opt);
      }
      else {
LAB_00164c0b:
        uVar85 = *(uint *)(p_Var36 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
        uVar72 = (ulong)uVar85;
        iVar92 = *(int *)(p_Var36 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        iVar95 = *(int *)(p_Var36 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
        local_6f8._0_8_ = (long)iVar95;
        iVar74 = *(int *)(p_Var36 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
        iVar79 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var36);
        lVar96 = (long)top_blob_int32.w;
        uVar115 = (ulong)(uint)top_blob_int32.h;
        if (opt->use_sgemm_convolution == true) {
          Mat::Mat((Mat *)&opt_q,top_blob_int32.h * top_blob_int32.w,uVar85 * uVar90,
                   bottom_blob_bordered.c,8,8,opt->workspace_allocator);
          uVar115 = 0;
          iVar77 = iVar117;
          if (iVar117 < 1) {
            iVar77 = 0;
          }
          if (iVar104 < 1) {
            iVar104 = 0;
          }
          uVar109 = (ulong)uVar90;
          if ((int)uVar90 < 1) {
            uVar109 = uVar115;
          }
          if ((int)uVar85 < 1) {
            uVar72 = 0;
          }
          local_728._0_8_ = uVar72;
          if (iVar89 < 1) {
            iVar89 = 0;
          }
          while (iVar114 = (int)uVar115, iVar114 != iVar89) {
            Mat::channel(&img,&bottom_blob_bordered,iVar114);
            local_6e8[0]._0_8_ = uVar115;
            Mat::channel(&kernel_tm,(Mat *)&opt_q,iVar114);
            puVar99 = (undefined8 *)kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            for (uVar115 = 0; uVar115 != uVar72; uVar115 = uVar115 + 1) {
              for (uVar81 = 0; uVar81 != uVar109; uVar81 = uVar81 + 1) {
                puVar102 = (undefined8 *)
                           (img.elemsize * (long)img.w * uVar115 * (long)iVar95 +
                            CONCAT44(img.data._4_4_,img.data._0_4_) + uVar81 * (long)iVar92 * 8);
                for (iVar113 = 0; iVar78 = iVar77, iVar113 != iVar104; iVar113 = iVar113 + 1) {
                  while (iVar78 != 0) {
                    *puVar99 = *puVar102;
                    puVar99 = puVar99 + 1;
                    puVar102 = puVar102 + iVar74;
                    iVar78 = iVar78 + -1;
                  }
                  puVar102 = puVar102 + ((long)(iVar93 * iVar79) - (long)(iVar74 * iVar117));
                }
              }
            }
            Mat::~Mat(&img);
            uVar115 = (ulong)(iVar114 + 1);
          }
          im2col_sgemm_pack8to4_int8_sse((Mat *)&opt_q,&top_blob_int32,&this->weight_data_int8,opt);
LAB_00165276:
          Mat::~Mat((Mat *)&opt_q);
        }
        else {
          uVar108 = uVar85 * uVar90;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&img,(long)(int)uVar108,
                     (allocator_type *)&opt_q);
          uVar100 = 0;
          uVar112 = uVar90;
          if ((int)uVar90 < 1) {
            uVar112 = uVar100;
          }
          if ((int)uVar85 < 1) {
            uVar85 = uVar100;
          }
          lVar105 = CONCAT44(img.data._4_4_,img.data._0_4_);
          iVar113 = 0;
          iVar114 = 0;
          uVar75 = uVar112;
          for (; uVar100 != uVar85; uVar100 = uVar100 + 1) {
            for (lVar101 = (long)iVar114; (int)uVar75 != lVar101; lVar101 = lVar101 + 1) {
              *(int *)(lVar105 + lVar101 * 4) = iVar113;
              iVar113 = iVar113 + iVar92;
            }
            iVar113 = iVar113 + (iVar93 * iVar95 - iVar92 * uVar90);
            uVar75 = uVar75 + uVar112;
            iVar114 = iVar114 + uVar112;
          }
          uVar109 = 0;
          uVar72 = (ulong)uVar108;
          if ((int)uVar108 < 1) {
            uVar72 = uVar109;
          }
          if (iVar89 < 1) {
            iVar89 = 0;
          }
          uVar81 = 0;
          if (0 < iVar117) {
            uVar81 = (ulong)(uint)iVar117;
          }
          if (iVar104 < 1) {
            uVar115 = uVar109;
          }
          uVar86 = (ulong)(uint)iVar77;
          if (iVar77 < 1) {
            uVar86 = uVar109;
          }
          for (iVar92 = 0; local_6c0 = (int)uVar86, iVar92 != local_6c0; iVar92 = iVar92 + 1) {
            Mat::channel((Mat *)&opt_q,&top_blob_int32,iVar92);
            local_758 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            Mat::~Mat((Mat *)&opt_q);
            for (uVar109 = 0; uVar109 != uVar115; uVar109 = uVar109 + 1) {
              for (uVar82 = 0; uVar82 != uVar81; uVar82 = uVar82 + 1) {
                Mat::channel((Mat *)&opt_q,&this->weight_data_int8,iVar92);
                lVar101 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
                Mat::~Mat((Mat *)&opt_q);
                local_6f8 = (undefined1  [16])0x0;
                local_728 = (undefined1  [16])0x0;
                local_6e8[0] = (undefined1  [16])0x0;
                local_778 = (undefined1  [16])0x0;
                for (iVar93 = 0; iVar93 != iVar89; iVar93 = iVar93 + 1) {
                  Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,iVar93);
                  for (lVar94 = 0; uVar72 * 4 != lVar94; lVar94 = lVar94 + 4) {
                    uVar119 = *(ulong *)((long)(int)opt_q._44_4_ * uVar109 * (long)iVar79 *
                                         (long)opt_q.workspace_allocator +
                                         CONCAT44(opt_q.num_threads,opt_q._0_4_) +
                                         (long)(iVar74 * 8 * (int)uVar82) +
                                        (long)*(int *)(lVar105 + lVar94) * 8);
                    cVar141 = (char)(uVar119 >> 8);
                    cVar142 = (char)(uVar119 >> 0x10);
                    cVar143 = (char)(uVar119 >> 0x18);
                    cVar144 = (char)(uVar119 >> 0x20);
                    cVar145 = (char)(uVar119 >> 0x28);
                    cVar146 = (char)(uVar119 >> 0x30);
                    auVar214._8_6_ = 0;
                    auVar214._0_8_ = uVar119;
                    auVar214[0xe] = (char)(uVar119 >> 0x38);
                    auVar214[0xf] = -((long)uVar119 < 0);
                    auVar213._14_2_ = auVar214._14_2_;
                    auVar213._8_5_ = 0;
                    auVar213._0_8_ = uVar119;
                    auVar213[0xd] = -(cVar146 < '\0');
                    auVar212._13_3_ = auVar213._13_3_;
                    auVar212._8_4_ = 0;
                    auVar212._0_8_ = uVar119;
                    auVar212[0xc] = cVar146;
                    auVar211._12_4_ = auVar212._12_4_;
                    auVar211._8_3_ = 0;
                    auVar211._0_8_ = uVar119;
                    auVar211[0xb] = -(cVar145 < '\0');
                    auVar210._11_5_ = auVar211._11_5_;
                    auVar210._8_2_ = 0;
                    auVar210._0_8_ = uVar119;
                    auVar210[10] = cVar145;
                    auVar209._10_6_ = auVar210._10_6_;
                    auVar209[8] = 0;
                    auVar209._0_8_ = uVar119;
                    auVar209[9] = -(cVar144 < '\0');
                    auVar208._9_7_ = auVar209._9_7_;
                    auVar208[8] = cVar144;
                    auVar208._0_8_ = uVar119;
                    Var40 = CONCAT91(CONCAT81(auVar208._8_8_,-(cVar143 < '\0')),cVar143);
                    auVar39._2_10_ = Var40;
                    auVar39[1] = -(cVar142 < '\0');
                    auVar39[0] = cVar142;
                    auVar38._2_12_ = auVar39;
                    auVar38[1] = -(cVar141 < '\0');
                    auVar38[0] = cVar141;
                    auVar207._0_2_ = CONCAT11(-((char)uVar119 < '\0'),(char)uVar119);
                    auVar207._2_14_ = auVar38;
                    auVar131 = *(undefined1 (*) [16])(lVar101 + lVar94 * 8);
                    auVar162 = *(undefined1 (*) [16])(lVar101 + 0x10 + lVar94 * 8);
                    auVar189._0_14_ = auVar131._0_14_;
                    auVar189[0xe] = auVar131[7];
                    auVar189[0xf] = -(auVar131[7] < '\0');
                    auVar188._14_2_ = auVar189._14_2_;
                    auVar188._0_13_ = auVar131._0_13_;
                    auVar188[0xd] = -(auVar131[6] < '\0');
                    auVar187._13_3_ = auVar188._13_3_;
                    auVar187._0_12_ = auVar131._0_12_;
                    auVar187[0xc] = auVar131[6];
                    auVar186._12_4_ = auVar187._12_4_;
                    auVar186._0_11_ = auVar131._0_11_;
                    auVar186[0xb] = -(auVar131[5] < '\0');
                    auVar185._11_5_ = auVar186._11_5_;
                    auVar185._0_10_ = auVar131._0_10_;
                    auVar185[10] = auVar131[5];
                    auVar184._10_6_ = auVar185._10_6_;
                    auVar184._0_9_ = auVar131._0_9_;
                    auVar184[9] = -(auVar131[4] < '\0');
                    auVar183._9_7_ = auVar184._9_7_;
                    auVar183._0_8_ = auVar131._0_8_;
                    auVar183[8] = auVar131[4];
                    Var43 = CONCAT91(CONCAT81(auVar183._8_8_,-(auVar131[3] < '\0')),auVar131[3]);
                    auVar42._2_10_ = Var43;
                    auVar42[1] = -(auVar131[2] < '\0');
                    auVar42[0] = auVar131[2];
                    auVar41._2_12_ = auVar42;
                    auVar41[1] = -(auVar131[1] < '\0');
                    auVar41[0] = auVar131[1];
                    auVar182._0_2_ = CONCAT11(-(auVar131[0] < '\0'),auVar131[0]);
                    auVar182._2_14_ = auVar41;
                    sVar147 = CONCAT11(-(auVar131[8] < '\0'),auVar131[8]);
                    uVar148 = CONCAT13(-(auVar131[9] < '\0'),CONCAT12(auVar131[9],sVar147));
                    uVar149 = CONCAT15(-(auVar131[10] < '\0'),CONCAT14(auVar131[10],uVar148));
                    uVar150 = CONCAT17(-(auVar131[0xb] < '\0'),CONCAT16(auVar131[0xb],uVar149));
                    auVar151._0_10_ =
                         CONCAT19(-(auVar131[0xc] < '\0'),CONCAT18(auVar131[0xc],uVar150));
                    auVar151[10] = auVar131[0xd];
                    auVar151[0xb] = -(auVar131[0xd] < '\0');
                    auVar152[0xc] = auVar131[0xe];
                    auVar152._0_12_ = auVar151;
                    auVar152[0xd] = -(auVar131[0xe] < '\0');
                    auVar153[0xe] = auVar131[0xf];
                    auVar153._0_14_ = auVar152;
                    auVar153[0xf] = -(auVar131[0xf] < '\0');
                    auVar178._0_14_ = auVar162._0_14_;
                    auVar178[0xe] = auVar162[7];
                    auVar178[0xf] = -(auVar162[7] < '\0');
                    auVar177._14_2_ = auVar178._14_2_;
                    auVar177._0_13_ = auVar162._0_13_;
                    auVar177[0xd] = -(auVar162[6] < '\0');
                    auVar176._13_3_ = auVar177._13_3_;
                    auVar176._0_12_ = auVar162._0_12_;
                    auVar176[0xc] = auVar162[6];
                    auVar190._12_4_ = auVar176._12_4_;
                    auVar190._0_11_ = auVar162._0_11_;
                    auVar190[0xb] = -(auVar162[5] < '\0');
                    auVar175._11_5_ = auVar190._11_5_;
                    auVar175._0_10_ = auVar162._0_10_;
                    auVar175[10] = auVar162[5];
                    auVar179._10_6_ = auVar175._10_6_;
                    auVar179._0_9_ = auVar162._0_9_;
                    auVar179[9] = -(auVar162[4] < '\0');
                    auVar174._9_7_ = auVar179._9_7_;
                    auVar174._0_8_ = auVar162._0_8_;
                    auVar174[8] = auVar162[4];
                    Var46 = CONCAT91(CONCAT81(auVar174._8_8_,-(auVar162[3] < '\0')),auVar162[3]);
                    auVar45._2_10_ = Var46;
                    auVar45[1] = -(auVar162[2] < '\0');
                    auVar45[0] = auVar162[2];
                    auVar44._2_12_ = auVar45;
                    auVar44[1] = -(auVar162[1] < '\0');
                    auVar44[0] = auVar162[1];
                    auVar173._0_2_ = CONCAT11(-(auVar162[0] < '\0'),auVar162[0]);
                    auVar173._2_14_ = auVar44;
                    sVar181 = CONCAT11(-(auVar162[8] < '\0'),auVar162[8]);
                    uVar122 = CONCAT13(-(auVar162[9] < '\0'),CONCAT12(auVar162[9],sVar181));
                    uVar126 = CONCAT15(-(auVar162[10] < '\0'),CONCAT14(auVar162[10],uVar122));
                    uVar127 = CONCAT17(-(auVar162[0xb] < '\0'),CONCAT16(auVar162[0xb],uVar126));
                    auVar128._0_10_ =
                         CONCAT19(-(auVar162[0xc] < '\0'),CONCAT18(auVar162[0xc],uVar127));
                    auVar128[10] = auVar162[0xd];
                    auVar128[0xb] = -(auVar162[0xd] < '\0');
                    auVar129[0xc] = auVar162[0xe];
                    auVar129._0_12_ = auVar128;
                    auVar129[0xd] = -(auVar162[0xe] < '\0');
                    auVar130[0xe] = auVar162[0xf];
                    auVar130._0_14_ = auVar129;
                    auVar130[0xf] = -(auVar162[0xf] < '\0');
                    sVar193 = auVar38._0_2_;
                    sVar194 = auVar39._0_2_;
                    sVar206 = (short)Var40;
                    sVar195 = sVar206 * (short)Var43;
                    sVar196 = auVar208._8_2_;
                    sVar197 = auVar210._10_2_;
                    sVar198 = auVar212._12_2_;
                    auVar190 = pmulhw(auVar182,auVar207);
                    sVar201 = sVar206 * (short)((ulong)uVar150 >> 0x30);
                    auVar162 = pmulhw(auVar153,auVar207);
                    sVar203 = sVar206 * (short)Var46;
                    auVar179 = pmulhw(auVar173,auVar207);
                    sVar206 = sVar206 * (short)((ulong)uVar127 >> 0x30);
                    auVar131 = pmulhw(auVar130,auVar207);
                    iVar117 = CONCAT22(auVar190._6_2_,sVar195);
                    Var40 = CONCAT64(CONCAT42(iVar117,auVar190._4_2_),
                                     CONCAT22(sVar194 * auVar42._0_2_,sVar195));
                    auVar47._4_8_ = (long)((unkuint10)Var40 >> 0x10);
                    auVar47._2_2_ = auVar190._2_2_;
                    auVar47._0_2_ = sVar193 * auVar41._0_2_;
                    iVar104 = CONCAT22(auVar162._6_2_,sVar201);
                    Var43 = CONCAT64(CONCAT42(iVar104,auVar162._4_2_),
                                     CONCAT22(sVar194 * (short)((uint6)uVar149 >> 0x20),sVar201));
                    auVar48._4_8_ = (long)((unkuint10)Var43 >> 0x10);
                    auVar48._2_2_ = auVar162._2_2_;
                    auVar48._0_2_ = sVar193 * (short)((uint)uVar148 >> 0x10);
                    iVar77 = CONCAT22(auVar179._6_2_,sVar203);
                    Var46 = CONCAT64(CONCAT42(iVar77,auVar179._4_2_),
                                     CONCAT22(sVar194 * auVar45._0_2_,sVar203));
                    auVar49._4_8_ = (long)((unkuint10)Var46 >> 0x10);
                    auVar49._2_2_ = auVar179._2_2_;
                    auVar49._0_2_ = sVar193 * auVar44._0_2_;
                    iVar95 = CONCAT22(auVar131._6_2_,sVar206);
                    Var59 = CONCAT64(CONCAT42(iVar95,auVar131._4_2_),
                                     CONCAT22(sVar194 * (short)((uint6)uVar126 >> 0x20),sVar206));
                    auVar50._4_8_ = (long)((unkuint10)Var59 >> 0x10);
                    auVar50._2_2_ = auVar131._2_2_;
                    auVar50._0_2_ = sVar193 * (short)((uint)uVar122 >> 0x10);
                    iVar114 = CONCAT22(auVar190._8_2_,sVar196 * auVar183._8_2_);
                    auVar191._0_8_ =
                         CONCAT26(auVar190._10_2_,CONCAT24(sVar197 * auVar185._10_2_,iVar114));
                    auVar191._8_2_ = sVar198 * auVar187._12_2_;
                    auVar191._10_2_ = auVar190._12_2_;
                    auVar192._12_2_ = auVar213._14_2_ * auVar188._14_2_;
                    auVar192._0_12_ = auVar191;
                    auVar192._14_2_ = auVar190._14_2_;
                    local_778._4_4_ =
                         local_778._4_4_ + auVar47._0_4_ + (int)((ulong)auVar191._0_8_ >> 0x20);
                    local_778._0_4_ =
                         local_778._0_4_ + CONCAT22(auVar190._0_2_,auVar207._0_2_ * auVar182._0_2_)
                         + iVar114;
                    local_778._8_4_ =
                         local_778._8_4_ + (int)((unkuint10)Var40 >> 0x10) + auVar191._8_4_;
                    local_778._12_4_ = local_778._12_4_ + iVar117 + auVar192._12_4_;
                    iVar117 = CONCAT22(auVar162._8_2_,
                                       sVar196 * (short)((unkuint10)auVar151._0_10_ >> 0x40));
                    auVar199._0_8_ =
                         CONCAT26(auVar162._10_2_,CONCAT24(sVar197 * auVar151._10_2_,iVar117));
                    auVar199._8_2_ = sVar198 * auVar152._12_2_;
                    auVar199._10_2_ = auVar162._12_2_;
                    auVar200._12_2_ = auVar213._14_2_ * auVar153._14_2_;
                    auVar200._0_12_ = auVar199;
                    auVar200._14_2_ = auVar162._14_2_;
                    local_6e8[0]._4_4_ =
                         local_6e8[0]._4_4_ + auVar48._0_4_ + (int)((ulong)auVar199._0_8_ >> 0x20);
                    local_6e8[0]._0_4_ =
                         local_6e8[0]._0_4_ + CONCAT22(auVar162._0_2_,auVar207._0_2_ * sVar147) +
                         iVar117;
                    local_6e8[0]._8_4_ =
                         local_6e8[0]._8_4_ + (int)((unkuint10)Var43 >> 0x10) + auVar199._8_4_;
                    local_6e8[0]._12_4_ = local_6e8[0]._12_4_ + iVar104 + auVar200._12_4_;
                    iVar117 = CONCAT22(auVar179._8_2_,sVar196 * auVar174._8_2_);
                    auVar202._0_8_ =
                         CONCAT26(auVar179._10_2_,CONCAT24(sVar197 * auVar175._10_2_,iVar117));
                    auVar202._8_2_ = sVar198 * auVar176._12_2_;
                    auVar202._10_2_ = auVar179._12_2_;
                    auVar162._12_2_ = auVar213._14_2_ * auVar177._14_2_;
                    auVar162._0_12_ = auVar202;
                    auVar162._14_2_ = auVar179._14_2_;
                    local_728._4_4_ =
                         local_728._4_4_ + auVar49._0_4_ + (int)((ulong)auVar202._0_8_ >> 0x20);
                    local_728._0_4_ =
                         local_728._0_4_ + CONCAT22(auVar179._0_2_,auVar207._0_2_ * auVar173._0_2_)
                         + iVar117;
                    local_728._8_4_ =
                         local_728._8_4_ + (int)((unkuint10)Var46 >> 0x10) + auVar202._8_4_;
                    local_728._12_4_ = local_728._12_4_ + iVar77 + auVar162._12_4_;
                    iVar117 = CONCAT22(auVar131._8_2_,
                                       sVar196 * (short)((unkuint10)auVar128._0_10_ >> 0x40));
                    auVar204._0_8_ =
                         CONCAT26(auVar131._10_2_,CONCAT24(sVar197 * auVar128._10_2_,iVar117));
                    auVar204._8_2_ = sVar198 * auVar129._12_2_;
                    auVar204._10_2_ = auVar131._12_2_;
                    auVar205._12_2_ = auVar213._14_2_ * auVar130._14_2_;
                    auVar205._0_12_ = auVar204;
                    auVar205._14_2_ = auVar131._14_2_;
                    local_6f8._4_4_ =
                         local_6f8._4_4_ + auVar50._0_4_ + (int)((ulong)auVar204._0_8_ >> 0x20);
                    local_6f8._0_4_ =
                         local_6f8._0_4_ + CONCAT22(auVar131._0_2_,auVar207._0_2_ * sVar181) +
                         iVar117;
                    local_6f8._8_4_ =
                         local_6f8._8_4_ + (int)((unkuint10)Var59 >> 0x10) + auVar204._8_4_;
                    local_6f8._12_4_ = local_6f8._12_4_ + iVar95 + auVar205._12_4_;
                  }
                  lVar101 = lVar101 + uVar72 * 0x20;
                  Mat::~Mat((Mat *)&opt_q);
                }
                piVar1 = (int *)(local_758 + uVar82 * 0x10);
                *piVar1 = local_778._12_4_ + local_778._8_4_ + local_778._4_4_ + local_778._0_4_;
                piVar1[1] = local_6e8[0]._12_4_ + local_6e8[0]._8_4_ +
                            local_6e8[0]._4_4_ + local_6e8[0]._0_4_;
                piVar1[2] = local_728._12_4_ + local_728._8_4_ + local_728._4_4_ + local_728._0_4_;
                piVar1[3] = local_6f8._12_4_ + local_6f8._8_4_ + local_6f8._4_4_ + local_6f8._0_4_;
              }
              local_758 = local_758 + lVar96 * 0x10;
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&img);
        }
      }
      Mat::Mat((Mat *)&opt_q,
               *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                       (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var73 = this->_vptr_Convolution_x86;
      for (lVar96 = 0; p_Var36 = pp_Var73[-3],
          lVar96 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
          lVar96 = lVar96 + 1) {
        fVar124 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var36) + lVar96 * 4);
        fVar171 = 0.0;
        if (fVar124 != 0.0) {
          fVar171 = 1.0 / (fVar124 * **(float **)(&this->field_0x238 + (long)p_Var36));
        }
        *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar96 * 4) = fVar171;
      }
      if (iVar118 < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x1a8 + (long)p_Var36),opt);
        pLVar37 = this->activation;
        if (pLVar37 != (Layer *)0x0) {
          (*pLVar37->_vptr_Layer[9])(pLVar37,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x280 + (long)p_Var36),
                   (Mat *)(&this->field_0x1a8 + (long)p_Var36),
                   *(int *)(p_Var36 + 0x1c + (long)&(this->weight_data_int8).data),
                   (Mat *)(p_Var36 + 0x20 + (long)&(this->weight_data_int8).data),opt);
      }
      Mat::~Mat((Mat *)&opt_q);
    }
    iVar104 = top_blob_int32.c;
    iVar117 = top_blob_int32.h;
    iVar93 = top_blob_int32.w;
    iVar89 = bottom_blob_bordered.c;
    iVar92 = bottom_blob_bordered.w;
    if (iVar80 == 1 && bVar67 == 1) {
      p_Var36 = this->_vptr_Convolution_x86[-3];
      iVar77 = *(int *)(p_Var36 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar95 = *(int *)(p_Var36 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar74 = *(int *)(p_Var36 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar79 = *(int *)(p_Var36 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar114 = *(int *)(p_Var36 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar113 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var36);
      lVar96 = (long)top_blob_int32.w;
      uVar115 = (ulong)(uint)top_blob_int32.h;
      uVar90 = iVar95 * iVar77;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&img,(long)(int)uVar90,
                 (allocator_type *)&opt_q);
      iVar69 = 0;
      iVar78 = iVar77;
      if (iVar77 < 1) {
        iVar78 = iVar69;
      }
      if (iVar95 < 1) {
        iVar95 = iVar69;
      }
      lVar105 = CONCAT44(img.data._4_4_,img.data._0_4_);
      iVar84 = 0;
      iVar70 = 0;
      iVar76 = iVar78;
      for (; iVar69 != iVar95; iVar69 = iVar69 + 1) {
        for (lVar101 = (long)iVar70; iVar76 != lVar101; lVar101 = lVar101 + 1) {
          *(int *)(lVar105 + lVar101 * 4) = iVar84;
          iVar84 = iVar84 + iVar74;
        }
        iVar84 = iVar84 + (iVar92 * iVar79 - iVar74 * iVar77);
        iVar76 = iVar76 + iVar78;
        iVar70 = iVar70 + iVar78;
      }
      uVar109 = 0;
      uVar72 = (ulong)uVar90;
      if ((int)uVar90 < 1) {
        uVar72 = uVar109;
      }
      if (iVar89 < 1) {
        iVar89 = 0;
      }
      local_728._0_4_ = iVar89;
      uVar81 = 0;
      if (0 < iVar93) {
        uVar81 = (ulong)(uint)iVar93;
      }
      if (iVar117 < 1) {
        uVar115 = uVar109;
      }
      if (iVar104 < 1) {
        iVar104 = 0;
      }
      local_6e8[0]._0_8_ = uVar72 * 4;
      while (iVar92 = (int)uVar109, iVar92 != iVar104) {
        Mat::channel((Mat *)&opt_q,&top_blob_int32,iVar92);
        local_790 = (undefined1 *)CONCAT44(opt_q.num_threads,opt_q._0_4_);
        Mat::~Mat((Mat *)&opt_q);
        for (uVar109 = 0; uVar109 != uVar115; uVar109 = uVar109 + 1) {
          lVar101 = uVar109 * (long)iVar113;
          local_6f8._0_8_ = lVar101;
          for (uVar86 = 0; uVar86 != uVar81; uVar86 = uVar86 + 1) {
            Mat::channel((Mat *)&opt_q,&this->weight_data_int8,iVar92);
            lVar94 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            Mat::~Mat((Mat *)&opt_q);
            local_778 = (undefined1  [16])0x0;
            for (iVar93 = 0; iVar93 != iVar89; iVar93 = iVar93 + 1) {
              Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,iVar93);
              for (uVar82 = 0; uVar72 != uVar82; uVar82 = uVar82 + 1) {
                auVar131 = ZEXT416((uint)(int)*(char *)((int)opt_q._44_4_ * lVar101 *
                                                        (long)opt_q.workspace_allocator +
                                                        CONCAT44(opt_q.num_threads,opt_q._0_4_) +
                                                        uVar86 * (long)iVar114 +
                                                       (long)*(int *)(lVar105 + uVar82 * 4)));
                auVar131 = pshuflw(auVar131,auVar131,0);
                auVar132._0_4_ = auVar131._0_4_;
                auVar132._4_4_ = auVar132._0_4_;
                auVar132._8_4_ = auVar132._0_4_;
                auVar132._12_4_ = auVar132._0_4_;
                uVar119 = *(ulong *)(lVar94 + uVar82 * 4);
                cVar141 = (char)(uVar119 >> 8);
                cVar142 = (char)(uVar119 >> 0x10);
                cVar143 = (char)(uVar119 >> 0x18);
                cVar144 = (char)(uVar119 >> 0x20);
                cVar145 = (char)(uVar119 >> 0x28);
                cVar146 = (char)(uVar119 >> 0x30);
                auVar161._8_6_ = 0;
                auVar161._0_8_ = uVar119;
                auVar161[0xe] = (char)(uVar119 >> 0x38);
                auVar161[0xf] = -((long)uVar119 < 0);
                auVar160._14_2_ = auVar161._14_2_;
                auVar160._8_5_ = 0;
                auVar160._0_8_ = uVar119;
                auVar160[0xd] = -(cVar146 < '\0');
                auVar159._13_3_ = auVar160._13_3_;
                auVar159._8_4_ = 0;
                auVar159._0_8_ = uVar119;
                auVar159[0xc] = cVar146;
                auVar158._12_4_ = auVar159._12_4_;
                auVar158._8_3_ = 0;
                auVar158._0_8_ = uVar119;
                auVar158[0xb] = -(cVar145 < '\0');
                auVar157._11_5_ = auVar158._11_5_;
                auVar157._8_2_ = 0;
                auVar157._0_8_ = uVar119;
                auVar157[10] = cVar145;
                auVar156._10_6_ = auVar157._10_6_;
                auVar156[8] = 0;
                auVar156._0_8_ = uVar119;
                auVar156[9] = -(cVar144 < '\0');
                auVar155._9_7_ = auVar156._9_7_;
                auVar155[8] = cVar144;
                auVar155._0_8_ = uVar119;
                Var40 = CONCAT91(CONCAT81(auVar155._8_8_,-(cVar143 < '\0')),cVar143);
                auVar52._2_10_ = Var40;
                auVar52[1] = -(cVar142 < '\0');
                auVar52[0] = cVar142;
                auVar51._2_12_ = auVar52;
                auVar51[1] = -(cVar141 < '\0');
                auVar51[0] = cVar141;
                auVar154._0_2_ = CONCAT11(-((char)uVar119 < '\0'),(char)uVar119);
                auVar154._2_14_ = auVar51;
                sVar181 = auVar131._2_2_ * (short)Var40;
                auVar162 = pmulhw(auVar154,auVar132);
                iVar117 = CONCAT22(auVar162._6_2_,sVar181);
                Var40 = CONCAT64(CONCAT42(iVar117,auVar162._4_2_),
                                 CONCAT22(auVar131._0_2_ * auVar52._0_2_,sVar181));
                auVar53._4_8_ = (long)((unkuint10)Var40 >> 0x10);
                auVar53._2_2_ = auVar162._2_2_;
                auVar53._0_2_ = auVar131._2_2_ * auVar51._0_2_;
                local_778._4_4_ = local_778._4_4_ + auVar53._0_4_;
                local_778._0_4_ =
                     local_778._0_4_ + CONCAT22(auVar162._0_2_,auVar131._0_2_ * auVar154._0_2_);
                local_778._8_4_ = local_778._8_4_ + (int)((unkuint10)Var40 >> 0x10);
                local_778._12_4_ = local_778._12_4_ + iVar117;
              }
              lVar94 = lVar94 + uVar72 * 4;
              Mat::~Mat((Mat *)&opt_q);
            }
            puVar99 = (undefined8 *)((long)local_790 + uVar86 * 0x10);
            *puVar99 = local_778._0_8_;
            puVar99[1] = local_778._8_8_;
          }
          local_790 = (undefined1 *)((long)local_790 + lVar96 * 0x10);
        }
        uVar109 = (ulong)(iVar92 + 1);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&img);
      Mat::Mat((Mat *)&opt_q,
               *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                       (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var73 = this->_vptr_Convolution_x86;
      for (lVar96 = 0; p_Var36 = pp_Var73[-3],
          lVar96 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
          lVar96 = lVar96 + 1) {
        fVar124 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var36) + lVar96 * 4);
        fVar171 = 0.0;
        if (fVar124 != 0.0) {
          fVar171 = 1.0 / (fVar124 * **(float **)(&this->field_0x238 + (long)p_Var36));
        }
        *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar96 * 4) = fVar171;
      }
      if (iVar118 < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x1a8 + (long)p_Var36),opt);
        pLVar37 = this->activation;
        if (pLVar37 != (Layer *)0x0) {
          (*pLVar37->_vptr_Layer[9])(pLVar37,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x280 + (long)p_Var36),
                   (Mat *)(&this->field_0x1a8 + (long)p_Var36),
                   *(int *)(p_Var36 + 0x1c + (long)&(this->weight_data_int8).data),
                   (Mat *)(p_Var36 + 0x20 + (long)&(this->weight_data_int8).data),opt);
      }
      Mat::~Mat((Mat *)&opt_q);
    }
    iVar104 = top_blob_int32.c;
    iVar117 = top_blob_int32.h;
    iVar93 = top_blob_int32.w;
    iVar89 = bottom_blob_bordered.c;
    iVar92 = bottom_blob_bordered.w;
    if ((iVar80 == 8) && (bVar67 != 1)) {
      p_Var36 = this->_vptr_Convolution_x86[-3];
      iVar77 = *(int *)(p_Var36 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar95 = *(int *)(p_Var36 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar74 = *(int *)(p_Var36 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
      iVar79 = *(int *)(p_Var36 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar114 = *(int *)(p_Var36 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
      iVar113 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var36);
      lVar96 = (long)top_blob_int32.w;
      uVar115 = (ulong)(uint)top_blob_int32.h;
      uVar90 = iVar95 * iVar77;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&img,(long)(int)uVar90,
                 (allocator_type *)&opt_q);
      iVar69 = 0;
      iVar78 = iVar77;
      if (iVar77 < 1) {
        iVar78 = iVar69;
      }
      if (iVar95 < 1) {
        iVar95 = iVar69;
      }
      lVar105 = CONCAT44(img.data._4_4_,img.data._0_4_);
      iVar84 = 0;
      iVar70 = 0;
      iVar76 = iVar78;
      for (; iVar69 != iVar95; iVar69 = iVar69 + 1) {
        for (lVar101 = (long)iVar70; iVar76 != lVar101; lVar101 = lVar101 + 1) {
          *(int *)(lVar105 + lVar101 * 4) = iVar84;
          iVar84 = iVar84 + iVar74;
        }
        iVar84 = iVar84 + (iVar92 * iVar79 - iVar74 * iVar77);
        iVar76 = iVar76 + iVar78;
        iVar70 = iVar70 + iVar78;
      }
      uVar109 = 0;
      uVar72 = (ulong)uVar90;
      if ((int)uVar90 < 1) {
        uVar72 = uVar109;
      }
      if (iVar89 < 1) {
        iVar89 = 0;
      }
      uVar81 = 0;
      if (0 < iVar93) {
        uVar81 = (ulong)(uint)iVar93;
      }
      if (iVar117 < 1) {
        uVar115 = uVar109;
      }
      if (iVar104 < 1) {
        iVar104 = 0;
      }
      local_6e8[0]._0_8_ = uVar72 * 8;
      while (iVar92 = (int)uVar109, iVar92 != iVar104) {
        Mat::channel((Mat *)&opt_q,&top_blob_int32,iVar92);
        local_790 = (undefined1 *)CONCAT44(opt_q.num_threads,opt_q._0_4_);
        Mat::~Mat((Mat *)&opt_q);
        for (uVar109 = 0; uVar109 != uVar115; uVar109 = uVar109 + 1) {
          lVar101 = uVar109 * (long)iVar113;
          local_6f8._0_8_ = lVar101;
          for (uVar86 = 0; uVar86 != uVar81; uVar86 = uVar86 + 1) {
            Mat::channel((Mat *)&opt_q,&this->weight_data_int8,iVar92);
            lVar94 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            Mat::~Mat((Mat *)&opt_q);
            local_788._0_4_ = (int)uVar86;
            lVar71 = (long)(iVar114 * 8 * (int)local_788);
            local_728._0_8_ = lVar71;
            iVar93 = 0;
            for (iVar117 = 0; iVar117 != iVar89; iVar117 = iVar117 + 1) {
              Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,iVar117);
              for (uVar82 = 0; uVar72 != uVar82; uVar82 = uVar82 + 1) {
                uVar119 = *(ulong *)((int)opt_q._44_4_ * lVar101 * (long)opt_q.workspace_allocator +
                                     CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar71 +
                                    (long)*(int *)(lVar105 + uVar82 * 4) * 8);
                cVar141 = (char)(uVar119 >> 8);
                cVar142 = (char)(uVar119 >> 0x10);
                cVar143 = (char)(uVar119 >> 0x18);
                cVar144 = (char)(uVar119 >> 0x20);
                cVar145 = (char)(uVar119 >> 0x28);
                cVar146 = (char)(uVar119 >> 0x30);
                auVar140._8_6_ = 0;
                auVar140._0_8_ = uVar119;
                auVar140[0xe] = (char)(uVar119 >> 0x38);
                auVar140[0xf] = -((long)uVar119 < 0);
                auVar139._14_2_ = auVar140._14_2_;
                auVar139._8_5_ = 0;
                auVar139._0_8_ = uVar119;
                auVar139[0xd] = -(cVar146 < '\0');
                auVar138._13_3_ = auVar139._13_3_;
                auVar138._8_4_ = 0;
                auVar138._0_8_ = uVar119;
                auVar138[0xc] = cVar146;
                auVar137._12_4_ = auVar138._12_4_;
                auVar137._8_3_ = 0;
                auVar137._0_8_ = uVar119;
                auVar137[0xb] = -(cVar145 < '\0');
                auVar136._11_5_ = auVar137._11_5_;
                auVar136._8_2_ = 0;
                auVar136._0_8_ = uVar119;
                auVar136[10] = cVar145;
                auVar135._10_6_ = auVar136._10_6_;
                auVar135[8] = 0;
                auVar135._0_8_ = uVar119;
                auVar135[9] = -(cVar144 < '\0');
                auVar134._9_7_ = auVar135._9_7_;
                auVar134[8] = cVar144;
                auVar134._0_8_ = uVar119;
                Var40 = CONCAT91(CONCAT81(auVar134._8_8_,-(cVar143 < '\0')),cVar143);
                auVar55._2_10_ = Var40;
                auVar55[1] = -(cVar142 < '\0');
                auVar55[0] = cVar142;
                auVar54._2_12_ = auVar55;
                auVar54[1] = -(cVar141 < '\0');
                auVar54[0] = cVar141;
                auVar133._0_2_ = CONCAT11(-((char)uVar119 < '\0'),(char)uVar119);
                auVar133._2_14_ = auVar54;
                uVar119 = *(ulong *)(lVar94 + uVar82 * 8);
                cVar141 = (char)(uVar119 >> 8);
                cVar142 = (char)(uVar119 >> 0x10);
                cVar143 = (char)(uVar119 >> 0x18);
                cVar144 = (char)(uVar119 >> 0x20);
                cVar145 = (char)(uVar119 >> 0x28);
                cVar146 = (char)(uVar119 >> 0x30);
                auVar170._8_6_ = 0;
                auVar170._0_8_ = uVar119;
                auVar170[0xe] = (char)(uVar119 >> 0x38);
                auVar170[0xf] = -((long)uVar119 < 0);
                auVar169._14_2_ = auVar170._14_2_;
                auVar169._8_5_ = 0;
                auVar169._0_8_ = uVar119;
                auVar169[0xd] = -(cVar146 < '\0');
                auVar168._13_3_ = auVar169._13_3_;
                auVar168._8_4_ = 0;
                auVar168._0_8_ = uVar119;
                auVar168[0xc] = cVar146;
                auVar167._12_4_ = auVar168._12_4_;
                auVar167._8_3_ = 0;
                auVar167._0_8_ = uVar119;
                auVar167[0xb] = -(cVar145 < '\0');
                auVar166._11_5_ = auVar167._11_5_;
                auVar166._8_2_ = 0;
                auVar166._0_8_ = uVar119;
                auVar166[10] = cVar145;
                auVar165._10_6_ = auVar166._10_6_;
                auVar165[8] = 0;
                auVar165._0_8_ = uVar119;
                auVar165[9] = -(cVar144 < '\0');
                auVar164._9_7_ = auVar165._9_7_;
                auVar164[8] = cVar144;
                auVar164._0_8_ = uVar119;
                Var43 = CONCAT91(CONCAT81(auVar164._8_8_,-(cVar143 < '\0')),cVar143);
                auVar57._2_10_ = Var43;
                auVar57[1] = -(cVar142 < '\0');
                auVar57[0] = cVar142;
                auVar56._2_12_ = auVar57;
                auVar56[1] = -(cVar141 < '\0');
                auVar56[0] = cVar141;
                auVar163._0_2_ = CONCAT11(-((char)uVar119 < '\0'),(char)uVar119);
                auVar163._2_14_ = auVar56;
                sVar181 = (short)Var43 * (short)Var40;
                auVar131 = pmulhw(auVar163,auVar133);
                iVar77 = CONCAT22(auVar131._6_2_,sVar181);
                Var40 = CONCAT64(CONCAT42(iVar77,auVar131._4_2_),
                                 CONCAT22(auVar57._0_2_ * auVar55._0_2_,sVar181));
                auVar58._4_8_ = (long)((unkuint10)Var40 >> 0x10);
                auVar58._2_2_ = auVar131._2_2_;
                auVar58._0_2_ = auVar56._0_2_ * auVar54._0_2_;
                iVar95 = CONCAT22(auVar131._8_2_,auVar164._8_2_ * auVar134._8_2_);
                auVar172._0_8_ =
                     CONCAT26(auVar131._10_2_,CONCAT24(auVar166._10_2_ * auVar136._10_2_,iVar95));
                auVar172._8_2_ = auVar168._12_2_ * auVar138._12_2_;
                auVar172._10_2_ = auVar131._12_2_;
                auVar180._12_2_ = auVar169._14_2_ * auVar139._14_2_;
                auVar180._0_12_ = auVar172;
                auVar180._14_2_ = auVar131._14_2_;
                iVar93 = iVar93 + auVar180._12_4_ + iVar77 +
                                  (int)((ulong)auVar172._0_8_ >> 0x20) + auVar58._0_4_ +
                                  auVar172._8_4_ + (int)((unkuint10)Var40 >> 0x10) +
                                  iVar95 + CONCAT22(auVar131._0_2_,auVar163._0_2_ * auVar133._0_2_);
              }
              lVar94 = lVar94 + uVar72 * 8;
              Mat::~Mat((Mat *)&opt_q);
            }
            *(int *)((long)local_790 + uVar86 * 4) = iVar93;
          }
          local_790 = (undefined1 *)((long)local_790 + lVar96 * 4);
        }
        uVar109 = (ulong)(iVar92 + 1);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&img);
      Mat::Mat((Mat *)&opt_q,
               *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                       (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
      pp_Var73 = this->_vptr_Convolution_x86;
      for (lVar96 = 0; p_Var36 = pp_Var73[-3],
          lVar96 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
          lVar96 = lVar96 + 1) {
        fVar124 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var36) + lVar96 * 4);
        fVar171 = 0.0;
        if (fVar124 != 0.0) {
          fVar171 = 1.0 / (fVar124 * **(float **)(&this->field_0x238 + (long)p_Var36));
        }
        *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar96 * 4) = fVar171;
      }
      if (iVar118 < 0x65) {
        dequantize_from_int32
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x1a8 + (long)p_Var36),opt);
        pLVar37 = this->activation;
        if (pLVar37 != (Layer *)0x0) {
          (*pLVar37->_vptr_Layer[9])(pLVar37,top_blob,opt);
        }
      }
      else {
        requantize_from_int32_to_int8
                  (&top_blob_int32,top_blob,(Mat *)&opt_q,
                   (Mat *)(&this->field_0x280 + (long)p_Var36),
                   (Mat *)(&this->field_0x1a8 + (long)p_Var36),
                   *(int *)(p_Var36 + 0x1c + (long)&(this->weight_data_int8).data),
                   (Mat *)(p_Var36 + 0x20 + (long)&(this->weight_data_int8).data),opt);
      }
      Mat::~Mat((Mat *)&opt_q);
    }
    iVar77 = top_blob_int32.c;
    iVar104 = top_blob_int32.h;
    iVar117 = top_blob_int32.w;
    iVar93 = bottom_blob_bordered.c;
    iVar89 = bottom_blob_bordered.w;
    iVar92 = 0;
    if (bVar67 == 0 && iVar80 == 1) {
      pp_Var73 = this->_vptr_Convolution_x86;
      if (((((opt->use_winograd_convolution == true) &&
            (p_Var36 = pp_Var73[-3],
            *(int *)(p_Var36 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
           (*(int *)(p_Var36 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data) == 3)) &&
          ((*(int *)(p_Var36 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
           (*(int *)(p_Var36 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) == 1)))) &&
         (((*(int *)(p_Var36 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data) == 1 &&
           ((*(int *)((long)&this->convolution_dilation1 + (long)p_Var36) == 1 &&
            (0xf < iVar80 * iVar91)))) &&
          (0xf < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data))))) {
        lVar96 = (long)bottom_blob_bordered.c;
        piVar1 = (int *)CONCAT44(bottom_blob_bordered.refcount._4_4_,
                                 bottom_blob_bordered.refcount._0_4_);
        opt_q._0_4_ = SUB84(bottom_blob_bordered.data,0);
        opt_q.num_threads = (int)((ulong)bottom_blob_bordered.data >> 0x20);
        opt_q.blob_allocator._0_4_ = bottom_blob_bordered.refcount._0_4_;
        opt_q.blob_allocator._4_4_ = bottom_blob_bordered.refcount._4_4_;
        opt_q.workspace_allocator = (Allocator *)bottom_blob_bordered.elemsize;
        opt_q.openmp_blocktime = bottom_blob_bordered.elempack;
        opt_q._32_8_ = bottom_blob_bordered.allocator;
        opt_q.use_shader_pack8 = (bool)(undefined1)bottom_blob_bordered.dims;
        opt_q.use_subgroup_basic = (bool)bottom_blob_bordered.dims._1_1_;
        opt_q.use_subgroup_vote = (bool)bottom_blob_bordered.dims._2_1_;
        opt_q.use_subgroup_ballot = (bool)bottom_blob_bordered.dims._3_1_;
        opt_q.use_subgroup_shuffle = (bool)(undefined1)bottom_blob_bordered.w;
        opt_q.use_image_storage = (bool)bottom_blob_bordered.w._1_1_;
        opt_q.use_tensor_storage = (bool)bottom_blob_bordered.w._2_1_;
        opt_q.use_weight_fp16_storage = (bool)bottom_blob_bordered.w._3_1_;
        opt_q.flush_denormals = bottom_blob_bordered.h;
        opt_q.use_local_pool_allocator = (bool)(undefined1)bottom_blob_bordered.d;
        opt_q.use_reserved_1 = (bool)bottom_blob_bordered.d._1_1_;
        opt_q.use_reserved_2 = (bool)bottom_blob_bordered.d._2_1_;
        opt_q.use_reserved_3 = (bool)bottom_blob_bordered.d._3_1_;
        opt_q.use_reserved_4 = (bool)(undefined1)bottom_blob_bordered.c;
        opt_q.use_reserved_5 = (bool)bottom_blob_bordered.c._1_1_;
        opt_q.use_reserved_6 = (bool)bottom_blob_bordered.c._2_1_;
        opt_q.use_reserved_7 = (bool)bottom_blob_bordered.c._3_1_;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        uVar90 = (top_blob_int32.w + 1) / 2;
        uVar115 = (long)(top_blob_int32.h + 1) / 2;
        iVar92 = (int)uVar115;
        iVar80 = uVar90 * 2 + 2;
        opt_b.lightmode = opt->lightmode;
        opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_b.num_threads = opt->num_threads;
        opt_b.workspace_allocator = opt->workspace_allocator;
        opt_b.openmp_blocktime = opt->openmp_blocktime;
        opt_b.use_winograd_convolution = opt->use_winograd_convolution;
        opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
        opt_b.use_int8_inference = opt->use_int8_inference;
        opt_b.use_vulkan_compute = opt->use_vulkan_compute;
        opt_b.use_bf16_storage = opt->use_bf16_storage;
        opt_b.use_fp16_packed = opt->use_fp16_packed;
        opt_b.use_fp16_storage = opt->use_fp16_storage;
        opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
        opt_b.use_int8_packed = opt->use_int8_packed;
        opt_b.use_int8_storage = opt->use_int8_storage;
        opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
        opt_b.use_packing_layout = opt->use_packing_layout;
        opt_b.use_shader_pack8 = opt->use_shader_pack8;
        opt_b.use_subgroup_basic = opt->use_subgroup_basic;
        opt_b.use_subgroup_vote = opt->use_subgroup_vote;
        opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
        opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
        opt_b.use_image_storage = opt->use_image_storage;
        opt_b.use_tensor_storage = opt->use_tensor_storage;
        opt_b.use_weight_fp16_storage = opt->use_weight_fp16_storage;
        opt_b.flush_denormals = opt->flush_denormals;
        opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
        opt_b.use_reserved_1 = opt->use_reserved_1;
        opt_b.use_reserved_2 = opt->use_reserved_2;
        opt_b.use_reserved_3 = opt->use_reserved_3;
        opt_b.use_reserved_4 = opt->use_reserved_4;
        opt_b.use_reserved_5 = opt->use_reserved_5;
        opt_b.use_reserved_6 = opt->use_reserved_6;
        opt_b.use_reserved_7 = opt->use_reserved_7;
        opt_b.use_reserved_8 = opt->use_reserved_8;
        opt_b.use_reserved_9 = opt->use_reserved_9;
        opt_b.use_reserved_10 = opt->use_reserved_10;
        opt_b.use_reserved_11 = opt->use_reserved_11;
        opt_b.blob_allocator = opt->workspace_allocator;
        copy_make_border(&bottom_blob_bordered,(Mat *)&opt_q,0,
                         (iVar92 * 2 - bottom_blob_bordered.h) + 2,0,iVar80 - bottom_blob_bordered.w
                         ,0,0.0,&opt_b);
        img.cstep = 0;
        img.data._0_4_ = 0;
        img.data._4_4_ = 0;
        img.refcount._0_4_ = 0;
        img.refcount._4_4_ = 0;
        img.elemsize = 0;
        img.elempack = 0;
        img._32_12_ = SUB1612((undefined1  [16])0x0,0);
        img.w = 0;
        img._48_12_ = SUB1612((undefined1  [16])0x0,4);
        uVar112 = iVar92 * uVar90;
        Mat::create(&img,0x10,uVar112,iVar93,2,opt->workspace_allocator);
        lVar105 = (long)iVar80;
        iVar91 = 0;
        uVar85 = 0;
        if (0 < (int)uVar90) {
          uVar85 = uVar90;
        }
        this_00 = &this->weight_data_3x3_winograd23_int8;
        uVar115 = uVar115 & 0xffffffff;
        if (iVar92 < 1) {
          uVar115 = 0;
        }
        iVar89 = 0;
        if (0 < iVar93) {
          iVar89 = iVar93;
        }
        for (; iVar91 != iVar89; iVar91 = iVar91 + 1) {
          Mat::channel(&kernel_tm,(Mat *)&opt_q,iVar91);
          pvVar62 = kernel_tm.data;
          Mat::~Mat(&kernel_tm);
          Mat::channel(&kernel_tm,&img,iVar91);
          pvVar110 = kernel_tm.data;
          Mat::~Mat(&kernel_tm);
          for (uVar72 = 0; uVar72 != uVar115; uVar72 = uVar72 + 1) {
            lVar83 = (long)(iVar80 * 2 * (int)uVar72) + (long)pvVar62;
            lVar101 = lVar83 + lVar105;
            lVar94 = lVar101 + lVar105;
            lVar71 = lVar94 + lVar105;
            for (uVar100 = 0; uVar100 != uVar85; uVar100 = uVar100 + 1) {
              for (lVar103 = 0; lVar103 != 4; lVar103 = lVar103 + 1) {
                *(short *)((long)&kernel_tm.data + lVar103 * 2) = (short)*(char *)(lVar83 + lVar103)
                ;
                *(short *)((long)sum0 + lVar103 * 2) = (short)*(char *)(lVar101 + lVar103);
                *(short *)((long)&requantize_scales.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar103 * 2) =
                     (short)*(char *)(lVar94 + lVar103);
                *(short *)((long)sum1 + lVar103 * 2) = (short)*(char *)(lVar71 + lVar103);
              }
              for (lVar103 = 0; auVar162 = _t2, auVar131 = _t3, lVar103 != 8; lVar103 = lVar103 + 2)
              {
                sVar181 = *(short *)((long)&requantize_scales.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_start + lVar103);
                *(short *)((long)sum2 + lVar103) =
                     *(short *)((long)&kernel_tm.data + lVar103) - sVar181;
                sVar147 = *(short *)((long)sum0 + lVar103);
                *(short *)((long)sum3 + lVar103) = sVar147 + sVar181;
                *(short *)((long)w2 + lVar103) = sVar181 - sVar147;
                *(short *)((long)w3 + lVar103) = *(short *)((long)sum1 + lVar103) - sVar147;
              }
              t0[0] = (short)sum2[0];
              t1[0] = sum2[0]._2_2_;
              t0[1] = (short)sum3[0];
              t1[1] = sum3[0]._2_2_;
              t2[1] = (short)sum3[1];
              t2[0] = (short)sum2[1];
              t3[1] = sum3[1]._2_2_;
              t3[0] = sum2[1]._2_2_;
              t0[2] = w2[0];
              t1[2] = w2[1];
              t2[2] = w2[2];
              t3[2] = w2[3];
              t0[3] = w3[0];
              t1[3] = w3[1];
              uStack_270 = auVar162._8_8_;
              t2[3] = w3[2];
              uStack_2b0 = auVar131._8_8_;
              t3[3] = w3[3];
              for (lVar103 = 0; lVar103 != 8; lVar103 = lVar103 + 2) {
                sVar181 = *(short *)((long)t2 + lVar103);
                *(short *)((long)&kernel_tm.data + lVar103) =
                     *(short *)((long)t0 + lVar103) - sVar181;
                sVar147 = *(short *)((long)t1 + lVar103);
                *(short *)((long)sum0 + lVar103) = sVar147 + sVar181;
                *(short *)((long)&requantize_scales.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar103) = sVar181 - sVar147;
                *(short *)((long)sum1 + lVar103) = *(short *)((long)t3 + lVar103) - sVar147;
              }
              for (lVar103 = 0; lVar103 != 8; lVar103 = lVar103 + 2) {
                *(undefined2 *)((long)pvVar110 + lVar103) =
                     *(undefined2 *)((long)&kernel_tm.data + lVar103);
                *(undefined2 *)((long)pvVar110 + lVar103 + 8) =
                     *(undefined2 *)((long)sum0 + lVar103);
                *(undefined2 *)((long)pvVar110 + lVar103 + 0x10) =
                     *(undefined2 *)
                      ((long)&requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar103);
                *(undefined2 *)((long)pvVar110 + lVar103 + 0x18) =
                     *(undefined2 *)((long)sum1 + lVar103);
              }
              lVar83 = lVar83 + 2;
              lVar101 = lVar101 + 2;
              lVar94 = lVar94 + 2;
              lVar71 = lVar71 + 2;
              pvVar110 = (void *)((long)pvVar110 + 0x20);
            }
          }
        }
        kernel_tm.cstep = 0;
        kernel_tm.data = (void *)0x0;
        kernel_tm.refcount._0_4_ = 0;
        kernel_tm.refcount._4_4_ = 0;
        kernel_tm._16_12_ = SUB1612((undefined1  [16])0x0,4);
        kernel_tm._32_12_ = SUB1612((undefined1  [16])0x0,0);
        kernel_tm.w = 0;
        kernel_tm._48_12_ = SUB1612((undefined1  [16])0x0,4);
        Mat::operator=((Mat *)&opt_q,&kernel_tm);
        Mat::~Mat(&kernel_tm);
        kernel_tm.cstep = 0;
        kernel_tm.data = (void *)0x0;
        kernel_tm.refcount._0_4_ = 0;
        kernel_tm.refcount._4_4_ = 0;
        kernel_tm._16_12_ = SUB1612((undefined1  [16])0x0,4);
        kernel_tm._32_12_ = SUB1612((undefined1  [16])0x0,0);
        kernel_tm.w = 0;
        kernel_tm._48_12_ = SUB1612((undefined1  [16])0x0,4);
        Mat::create(&kernel_tm,0x10,uVar112,iVar77,4,opt->workspace_allocator);
        iVar80 = iVar77 >> 2;
        uVar100 = iVar77 & 0xfffffffc;
        uVar109 = 0;
        uVar72 = (ulong)uVar112;
        if ((int)uVar112 < 1) {
          uVar72 = uVar109;
        }
        if (iVar80 < 1) {
          iVar80 = 0;
        }
        while( true ) {
          iVar91 = (int)uVar109;
          if (iVar91 == iVar80) break;
          uVar112 = iVar91 * 4;
          Mat::channel((Mat *)sum0,&kernel_tm,uVar112);
          Mat::channel((Mat *)&requantize_scales,&kernel_tm,uVar112 | 1);
          Mat::channel((Mat *)sum1,&kernel_tm,uVar112 | 2);
          local_728._0_4_ = uVar112;
          Mat::channel((Mat *)sum2,&kernel_tm,uVar112 | 3);
          Mat::channel((Mat *)sum3,this_00,uVar112);
          Mat::channel((Mat *)w2,this_00,uVar112 | 1);
          Mat::channel((Mat *)w3,this_00,uVar112 | 2);
          Mat::channel((Mat *)t0,this_00,uVar112 | 3);
          for (uVar109 = 0;
              pfVar66 = requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage, uVar127 = sum0._0_8_,
              uVar109 != uVar72; uVar109 = uVar109 + 1) {
            pfVar65 = requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar150 = sum1._0_8_;
            uVar63 = sum2._0_8_;
            _t2 = (undefined1  [16])0x0;
            _t3 = (undefined1  [16])0x0;
            sum2_2[0xc] = 0;
            sum2_2[0xd] = 0;
            sum2_2[0xe] = 0;
            sum2_2[0xf] = 0;
            sum2_2[8] = 0;
            sum2_2[9] = 0;
            sum2_2[10] = 0;
            sum2_2[0xb] = 0;
            sum2_2[4] = 0;
            sum2_2[5] = 0;
            sum2_2[6] = 0;
            sum2_2[7] = 0;
            sum2_2[0] = 0;
            sum2_2[1] = 0;
            sum2_2[2] = 0;
            sum2_2[3] = 0;
            sum3_2[0xc] = 0;
            sum3_2[0xd] = 0;
            sum3_2[0xe] = 0;
            sum3_2[0xf] = 0;
            sum3_2[8] = 0;
            sum3_2[9] = 0;
            sum3_2[10] = 0;
            sum3_2[0xb] = 0;
            sum3_2[4] = 0;
            sum3_2[5] = 0;
            sum3_2[6] = 0;
            sum3_2[7] = 0;
            sum3_2[0] = 0;
            sum3_2[1] = 0;
            sum3_2[2] = 0;
            sum3_2[3] = 0;
            uVar81 = 0;
            while( true ) {
              if (lVar96 <= (long)(uVar81 | 3)) break;
              uVar112 = (uint)uVar81;
              Mat::channel((Mat *)t1,&img,uVar112);
              lVar105 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              local_6f8._0_8_ = (long)local_37c;
              Mat::~Mat((Mat *)t1);
              Mat::channel((Mat *)t1,&img,uVar112 | 1);
              local_6e8[0]._0_8_ = local_398;
              lVar101 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              Mat::~Mat((Mat *)t1);
              local_728._0_8_ = uVar81;
              Mat::channel((Mat *)t1,&img,uVar112 | 2);
              lVar94 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              Mat::~Mat((Mat *)t1);
              Mat::channel((Mat *)t1,&img,uVar112 | 3);
              lVar71 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              Mat::~Mat((Mat *)t1);
              lVar83 = CONCAT26(t0[3],CONCAT24(t0[2],CONCAT22(t0[1],t0[0]))) +
                       local_2f8 * uVar81 * (long)local_2dc;
              lVar103 = CONCAT26(w3[3],CONCAT24(w3[2],CONCAT22(w3[1],w3[0]))) +
                        local_208 * uVar81 * (long)local_1ec;
              lVar88 = CONCAT26(w2[3],CONCAT24(w2[2],CONCAT22(w2[1],w2[0]))) +
                       local_1b8 * uVar81 * (long)local_19c;
              lVar97 = sum3._0_8_ + local_348 * uVar81 * (long)local_32c;
              for (lVar98 = 0; lVar98 != 0x20; lVar98 = lVar98 + 2) {
                iVar89 = (int)*(short *)(lVar105 + local_398 * uVar109 * (long)local_37c + lVar98);
                iVar93 = (int)*(short *)(lVar101 + local_398 * uVar109 * (long)local_37c + lVar98);
                iVar117 = (int)*(short *)(lVar94 + local_398 * uVar109 * (long)local_37c + lVar98);
                iVar104 = (int)*(short *)(local_398 * uVar109 * (long)local_37c + lVar71 + lVar98);
                *(int *)(t2 + lVar98) =
                     *(short *)(lVar97 + 0x60 + lVar98) * iVar104 +
                     *(short *)(lVar97 + 0x40 + lVar98) * iVar117 +
                     *(short *)(lVar97 + 0x20 + lVar98) * iVar93 +
                     *(short *)(lVar97 + lVar98) * iVar89 + *(int *)(t2 + lVar98);
                *(int *)(t3 + lVar98) =
                     *(short *)(lVar88 + 0x60 + lVar98) * iVar104 +
                     *(short *)(lVar88 + 0x40 + lVar98) * iVar117 +
                     *(short *)(lVar88 + 0x20 + lVar98) * iVar93 +
                     *(short *)(lVar88 + lVar98) * iVar89 + *(int *)(t3 + lVar98);
                *(int *)((long)sum2_2 + lVar98 * 2) =
                     *(short *)(lVar103 + 0x60 + lVar98) * iVar104 +
                     *(short *)(lVar103 + 0x40 + lVar98) * iVar117 +
                     *(short *)(lVar103 + 0x20 + lVar98) * iVar93 +
                     *(short *)(lVar103 + lVar98) * iVar89 + *(int *)((long)sum2_2 + lVar98 * 2);
                *(int *)((long)sum3_2 + lVar98 * 2) =
                     *(short *)(lVar83 + 0x60 + lVar98) * iVar104 +
                     *(short *)(lVar83 + 0x40 + lVar98) * iVar117 +
                     *(short *)(lVar83 + 0x20 + lVar98) * iVar93 +
                     *(short *)(lVar83 + lVar98) * iVar89 + *(int *)((long)sum3_2 + lVar98 * 2);
              }
              uVar81 = uVar81 + 4;
            }
            for (; (long)uVar81 < lVar96; uVar81 = uVar81 + 1) {
              Mat::channel((Mat *)t1,&img,(int)uVar81);
              lVar105 = CONCAT26(t1[3],CONCAT24(t1[2],CONCAT22(t1[1],t1[0])));
              Mat::~Mat((Mat *)t1);
              for (lVar101 = 0; lVar101 != 0x20; lVar101 = lVar101 + 2) {
                iVar89 = (int)*(short *)(local_398 * uVar109 * (long)local_37c + lVar105 + lVar101);
                *(int *)(t2 + lVar101) =
                     *(int *)(t2 + lVar101) +
                     *(short *)(local_348 * uVar81 * (long)local_32c + sum3._0_8_ + lVar101) *
                     iVar89;
                *(int *)(t3 + lVar101) =
                     *(int *)(t3 + lVar101) +
                     *(short *)(local_1b8 * uVar81 * (long)local_19c +
                                CONCAT26(w2[3],CONCAT24(w2[2],CONCAT22(w2[1],w2[0]))) + lVar101) *
                     iVar89;
                piVar1 = (int *)((long)sum2_2 + lVar101 * 2);
                *piVar1 = *piVar1 + *(short *)(local_208 * uVar81 * (long)local_1ec +
                                               CONCAT26(w3[3],CONCAT24(w3[2],CONCAT22(w3[1],w3[0])))
                                              + lVar101) * iVar89;
                piVar1 = (int *)((long)sum3_2 + lVar101 * 2);
                *piVar1 = *piVar1 + *(short *)(local_2f8 * uVar81 * (long)local_2dc +
                                               CONCAT26(t0[3],CONCAT24(t0[2],CONCAT22(t0[1],t0[0])))
                                              + lVar101) * iVar89;
              }
            }
            for (lVar105 = 0; lVar105 != 0x40; lVar105 = lVar105 + 4) {
              *(undefined4 *)(uVar127 + local_638 * uVar109 * (long)iStack_61c + lVar105) =
                   *(undefined4 *)((long)t2 + lVar105);
              *(undefined4 *)((long)pfVar65 + lVar105 + (long)pfVar66 * uVar109 * (long)local_41c) =
                   *(undefined4 *)((long)t3 + lVar105);
              *(undefined4 *)(uVar150 + local_4e8 * uVar109 * (long)local_4cc + lVar105) =
                   *(undefined4 *)((long)sum2_2 + lVar105);
              *(undefined4 *)(uVar63 + local_3e8 * uVar109 * (long)iStack_3cc + lVar105) =
                   *(undefined4 *)((long)sum3_2 + lVar105);
            }
          }
          Mat::~Mat((Mat *)t0);
          Mat::~Mat((Mat *)w3);
          Mat::~Mat((Mat *)w2);
          Mat::~Mat((Mat *)sum3);
          Mat::~Mat((Mat *)sum2);
          Mat::~Mat((Mat *)sum1);
          Mat::~Mat((Mat *)&requantize_scales);
          Mat::~Mat((Mat *)sum0);
          uVar109 = (ulong)(iVar91 + 1);
        }
        for (; (int)uVar100 < iVar77; uVar100 = uVar100 + 1) {
          Mat::channel((Mat *)sum0,&kernel_tm,uVar100);
          Mat::channel((Mat *)&requantize_scales,this_00,uVar100);
          for (uVar109 = 0; uVar127 = sum0._0_8_, uVar109 != uVar72; uVar109 = uVar109 + 1) {
            sum2[0] = 0;
            sum2[1] = 0;
            sum2[2] = 0;
            sum2[3] = 0;
            local_728._0_8_ = 1;
            local_6f8._0_8_ = 2;
            local_6e8[0]._0_8_ = 3;
            uVar81 = 0;
            while( true ) {
              if (lVar96 <= (long)(uVar81 | 3)) break;
              uVar112 = (uint)uVar81;
              Mat::channel((Mat *)sum1,&img,uVar112);
              uVar150 = sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              Mat::channel((Mat *)sum1,&img,uVar112 | 1);
              uVar63 = sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              Mat::channel((Mat *)sum1,&img,uVar112 | 2);
              uVar64 = sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              Mat::channel((Mat *)sum1,&img,uVar112 | 3);
              lVar94 = local_4e8 * uVar109 * (long)local_4cc + sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              lVar105 = (long)local_41c;
              for (lVar101 = 0; lVar101 != 0x20; lVar101 = lVar101 + 2) {
                *(int *)((long)sum2 + lVar101 * 2) =
                     (int)*(short *)((long)requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start +
                                    lVar101 + (long)requantize_scales.
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                              * local_6e8[0]._0_8_ * lVar105) *
                     (int)*(short *)(lVar94 + lVar101) +
                     (int)*(short *)((long)requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start +
                                    lVar101 + (long)requantize_scales.
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                              * local_6f8._0_8_ * lVar105) *
                     (int)*(short *)(uVar64 + local_4e8 * uVar109 * (long)local_4cc + lVar101) +
                     (int)*(short *)((long)requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start +
                                    lVar101 + (long)requantize_scales.
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                              * local_728._0_8_ * lVar105) *
                     (int)*(short *)(uVar63 + local_4e8 * uVar109 * (long)local_4cc + lVar101) +
                     (int)*(short *)((long)requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start +
                                    lVar101 + (long)requantize_scales.
                                                                                                        
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                              * uVar81 * lVar105) *
                     (int)*(short *)(uVar150 + local_4e8 * uVar109 * (long)local_4cc + lVar101) +
                     *(int *)((long)sum2 + lVar101 * 2);
              }
              uVar81 = uVar81 + 4;
              local_6e8[0]._0_8_ = local_6e8[0]._0_8_ + 4;
              local_6f8._0_8_ = local_6f8._0_8_ + 4;
              local_728._0_8_ = local_728._0_8_ + 4;
            }
            for (; (long)uVar81 < lVar96; uVar81 = uVar81 + 1) {
              Mat::channel((Mat *)sum1,&img,(int)uVar81);
              lVar101 = local_4e8 * uVar109 * (long)local_4cc + sum1._0_8_;
              Mat::~Mat((Mat *)sum1);
              for (lVar105 = 0; lVar105 != 0x10; lVar105 = lVar105 + 1) {
                sum2[lVar105] =
                     sum2[lVar105] +
                     (int)*(short *)((long)requantize_scales.
                                           super__Vector_base<float,_std::allocator<float>_>._M_impl
                                           .super__Vector_impl_data._M_start +
                                    lVar105 * 2 +
                                    (long)requantize_scales.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage * uVar81 *
                                    (long)local_41c) * (int)*(short *)(lVar101 + lVar105 * 2);
              }
            }
            for (lVar105 = 0; lVar105 != 0x10; lVar105 = lVar105 + 1) {
              *(int *)(uVar127 + local_638 * uVar109 * (long)iStack_61c + lVar105 * 4) =
                   sum2[lVar105];
            }
          }
          Mat::~Mat((Mat *)&requantize_scales);
          Mat::~Mat((Mat *)sum0);
        }
        sum0[0] = 0;
        sum0[1] = 0;
        sum0[2] = 0;
        sum0[3] = 0;
        Mat::operator=(&img,(Mat *)sum0);
        Mat::~Mat((Mat *)sum0);
        sum0[0] = 0;
        sum0[1] = 0;
        sum0[2] = 0;
        sum0[3] = 0;
        Mat::create((Mat *)sum0,uVar90 * 2,iVar92 * 2,iVar77,4,opt->workspace_allocator);
        iVar92 = 0;
        if (iVar77 < 1) {
          iVar77 = 0;
        }
        for (; iVar92 != iVar77; iVar92 = iVar92 + 1) {
          Mat::channel((Mat *)&requantize_scales,&kernel_tm,iVar92);
          Mat::channel((Mat *)sum1,(Mat *)sum0,iVar92);
          lVar96 = 0;
          for (uVar72 = 0; uVar72 != uVar115; uVar72 = uVar72 + 1) {
            puVar99 = (undefined8 *)(uVar72 * 2 * (long)local_4cc * local_4e8 + sum1._0_8_);
            puVar102 = (undefined8 *)((uVar72 * 2 + 1) * (long)local_4cc * local_4e8 + sum1._0_8_);
            lVar105 = (long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage * lVar96;
            for (uVar109 = 0; uVar109 != uVar85; uVar109 = uVar109 + 1) {
              lVar94 = local_41c * lVar105;
              for (lVar101 = 0; lVar101 != 0x10; lVar101 = lVar101 + 4) {
                *(undefined4 *)((long)sum2 + lVar101) =
                     *(undefined4 *)
                      ((long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar101 + lVar94);
                *(undefined4 *)((long)sum3 + lVar101) =
                     *(undefined4 *)
                      ((long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar101 + lVar94 + 0x10);
                *(undefined4 *)((long)w2 + lVar101) =
                     *(undefined4 *)
                      ((long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar101 + lVar94 + 0x20);
                *(undefined4 *)((long)w3 + lVar101) =
                     *(undefined4 *)
                      ((long)requantize_scales.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_start + lVar101 + lVar94 + 0x30);
              }
              for (lVar101 = 0; auVar162 = _t2, auVar131 = _t3, lVar101 != 0x10;
                  lVar101 = lVar101 + 4) {
                *(int *)((long)t0 + lVar101) =
                     *(int *)((long)sum2 + lVar101) + *(int *)((long)sum3 + lVar101) +
                     *(int *)((long)w2 + lVar101);
                *(int *)((long)t1 + lVar101) =
                     (*(int *)((long)sum3 + lVar101) - *(int *)((long)w2 + lVar101)) +
                     *(int *)((long)w3 + lVar101);
              }
              t2[1] = t0[1];
              t2[0] = t0[0];
              t3[1] = t0[3];
              t3[0] = t0[2];
              t2[3] = t1[1];
              t2[2] = t1[0];
              t3[3] = t1[3];
              t3[2] = t1[2];
              uStack_270 = auVar162._8_8_;
              uStack_2b0 = auVar131._8_8_;
              sum2_2[1] = local_3a0;
              sum2_2[0] = local_300;
              sum3_2[1] = local_39c;
              sum3_2[0] = local_2fc;
              for (lVar101 = 0; lVar101 != 8; lVar101 = lVar101 + 4) {
                *(int *)((long)o0 + lVar101) =
                     *(int *)((long)t2 + lVar101) + *(int *)((long)t3 + lVar101) +
                     *(int *)((long)sum2_2 + lVar101);
                *(int *)((long)local_228 + lVar101) =
                     (*(int *)((long)t3 + lVar101) - *(int *)((long)sum2_2 + lVar101)) +
                     *(int *)((long)sum3_2 + lVar101);
              }
              *puVar99 = CONCAT44(o0[1] >> 2,o0[0] >> 2);
              *puVar102 = CONCAT44(local_228[1] >> 2,local_228[0] >> 2);
              puVar99 = puVar99 + 1;
              puVar102 = puVar102 + 1;
              lVar105 = lVar105 + (long)requantize_scales.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage;
            }
            lVar96 = lVar96 + (int)uVar90;
          }
          Mat::~Mat((Mat *)sum1);
          Mat::~Mat((Mat *)&requantize_scales);
        }
        copy_cut_border((Mat *)sum0,&top_blob_int32,0,-top_blob_int32.h,0,-top_blob_int32.w,opt);
        Mat::~Mat((Mat *)sum0);
        Mat::~Mat(&kernel_tm);
        Mat::~Mat(&img);
        Mat::~Mat((Mat *)&opt_q);
        Mat::Mat((Mat *)&opt_q,
                 *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                         (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
        pp_Var73 = this->_vptr_Convolution_x86;
        for (lVar96 = 0; p_Var36 = pp_Var73[-3],
            lVar96 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
            lVar96 = lVar96 + 1) {
          fVar124 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var36) + lVar96 * 4);
          fVar171 = 0.0;
          if (fVar124 != 0.0) {
            fVar171 = 1.0 / (fVar124 * **(float **)(&this->field_0x238 + (long)p_Var36));
          }
          *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar96 * 4) = fVar171;
        }
        if (iVar118 < 0x65) {
          dequantize_from_int32
                    (&top_blob_int32,top_blob,(Mat *)&opt_q,
                     (Mat *)(&this->field_0x1a8 + (long)p_Var36),opt);
          pLVar37 = this->activation;
          if (pLVar37 != (Layer *)0x0) {
            (*pLVar37->_vptr_Layer[9])(pLVar37,top_blob,opt);
          }
        }
        else {
          requantize_from_int32_to_int8
                    (&top_blob_int32,top_blob,(Mat *)&opt_q,
                     (Mat *)(&this->field_0x280 + (long)p_Var36),
                     (Mat *)(&this->field_0x1a8 + (long)p_Var36),
                     *(int *)(p_Var36 + 0x1c + (long)&(this->weight_data_int8).data),
                     (Mat *)(p_Var36 + 0x20 + (long)&(this->weight_data_int8).data),opt);
        }
LAB_001667c3:
        Mat::~Mat((Mat *)&opt_q);
      }
      else {
        p_Var36 = pp_Var73[-3];
        iVar92 = *(int *)(p_Var36 + 0x3c + (long)&(this->weight_data_3x3_winograd63).data);
        if ((((opt->use_sgemm_convolution != true) || (iVar92 != 1)) ||
            (iVar92 = 1,
            *(int *)(p_Var36 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data) != 1)) ||
           (1 < *(uint *)(p_Var36 + 0x1c + (long)&(this->weight_data_int8).data))) {
          iVar80 = *(int *)(p_Var36 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar91 = *(int *)(p_Var36 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar95 = *(int *)(p_Var36 + 0x40 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar74 = *(int *)(p_Var36 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar79 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var36);
          lVar96 = (long)top_blob_int32.w;
          uVar115 = (ulong)(uint)top_blob_int32.h;
          uVar72 = (ulong)(uint)top_blob_int32.c;
          uVar90 = iVar91 * iVar80;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&img,(long)(int)uVar90,
                     (allocator_type *)&opt_q);
          iVar113 = 0;
          iVar114 = iVar80;
          if (iVar80 < 1) {
            iVar114 = iVar113;
          }
          if (iVar91 < 1) {
            iVar91 = iVar113;
          }
          lVar105 = CONCAT44(img.data._4_4_,img.data._0_4_);
          iVar69 = 0;
          iVar78 = iVar114;
          for (iVar76 = 0; iVar76 != iVar91; iVar76 = iVar76 + 1) {
            for (lVar101 = (long)iVar69; iVar78 != lVar101; lVar101 = lVar101 + 1) {
              *(int *)(lVar105 + lVar101 * 4) = iVar113;
              iVar113 = iVar113 + iVar92;
            }
            iVar113 = iVar113 + (iVar89 * iVar95 - iVar92 * iVar80);
            iVar78 = iVar78 + iVar114;
            iVar69 = iVar69 + iVar114;
          }
          uVar85 = uVar90;
          if ((int)uVar90 < 1) {
            uVar85 = 0;
          }
          uVar112 = iVar93;
          if (iVar93 < 1) {
            uVar112 = 0;
          }
          uVar109 = 0;
          if (0 < iVar117) {
            uVar109 = (ulong)(uint)iVar117;
          }
          if (iVar104 < 1) {
            uVar115 = 0;
          }
          if (iVar77 < 1) {
            uVar72 = 0;
          }
          for (uVar81 = 0; uVar81 != uVar72; uVar81 = uVar81 + 1) {
            Mat::channel((Mat *)&opt_q,&top_blob_int32,(int)uVar81);
            local_790 = (undefined1 *)CONCAT44(opt_q.num_threads,opt_q._0_4_);
            Mat::~Mat((Mat *)&opt_q);
            for (uVar86 = 0; uVar86 != uVar115; uVar86 = uVar86 + 1) {
              for (uVar82 = 0; uVar82 != uVar109; uVar82 = uVar82 + 1) {
                lVar101 = *(long *)(p_Var36 + 0x28 +
                                   (long)&(this->weight_data_3x3_winograd23_int8).data) +
                          (long)(int)(iVar93 * uVar90 * (int)uVar81);
                iVar92 = 0;
                for (uVar100 = 0; uVar100 != uVar112; uVar100 = uVar100 + 1) {
                  Mat::channel((Mat *)&opt_q,&bottom_blob_bordered,uVar100);
                  for (uVar119 = 0; uVar85 != uVar119; uVar119 = uVar119 + 1) {
                    iVar92 = iVar92 + (int)*(char *)(lVar101 + uVar119) *
                                      (int)*(char *)((long)(int)opt_q._44_4_ * uVar86 * (long)iVar79
                                                     * (long)opt_q.workspace_allocator +
                                                     CONCAT44(opt_q.num_threads,opt_q._0_4_) +
                                                     uVar82 * (long)iVar74 +
                                                    (long)*(int *)(lVar105 + uVar119 * 4));
                  }
                  lVar101 = lVar101 + (int)uVar90;
                  Mat::~Mat((Mat *)&opt_q);
                }
                *(int *)((long)local_790 + uVar82 * 4) = iVar92;
              }
              local_790 = (undefined1 *)((long)local_790 + lVar96 * 4);
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&img);
          Mat::Mat((Mat *)&opt_q,
                   *(int *)(this->_vptr_Convolution_x86[-3] + 0x30 +
                           (long)&(this->weight_data_3x3_winograd63).data),4,(Allocator *)0x0);
          pp_Var73 = this->_vptr_Convolution_x86;
          for (lVar96 = 0; p_Var36 = pp_Var73[-3],
              lVar96 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
              lVar96 = lVar96 + 1) {
            fVar124 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var36) + lVar96 * 4);
            fVar171 = 0.0;
            if (fVar124 != 0.0) {
              fVar171 = 1.0 / (fVar124 * **(float **)(&this->field_0x238 + (long)p_Var36));
            }
            *(float *)(CONCAT44(opt_q.num_threads,opt_q._0_4_) + lVar96 * 4) = fVar171;
          }
          if (iVar118 < 0x65) {
            dequantize_from_int32
                      (&top_blob_int32,top_blob,(Mat *)&opt_q,
                       (Mat *)(&this->field_0x1a8 + (long)p_Var36),opt);
            pLVar37 = this->activation;
            if (pLVar37 != (Layer *)0x0) {
              (*pLVar37->_vptr_Layer[9])(pLVar37,top_blob,opt);
            }
          }
          else {
            requantize_from_int32_to_int8
                      (&top_blob_int32,top_blob,(Mat *)&opt_q,
                       (Mat *)(&this->field_0x280 + (long)p_Var36),
                       (Mat *)(&this->field_0x1a8 + (long)p_Var36),
                       *(int *)(p_Var36 + 0x1c + (long)&(this->weight_data_int8).data),
                       (Mat *)(p_Var36 + 0x20 + (long)&(this->weight_data_int8).data),opt);
          }
          goto LAB_001667c3;
        }
        if (iVar118 < 0x65) {
          local_710 = 3;
          local_738 = 2;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          for (lVar96 = 0; p_Var36 = pp_Var73[-3],
              lVar96 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
              lVar96 = lVar96 + 1) {
            fVar124 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var36) + lVar96 * 4);
            opt_q._0_4_ = 0.0;
            if (fVar124 != 0.0) {
              opt_q._0_4_ = 1.0 / (fVar124 * **(float **)(&this->field_0x238 + (long)p_Var36));
            }
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict *)&opt_q);
            pp_Var73 = this->_vptr_Convolution_x86;
          }
          uVar90 = *(uint *)(p_Var36 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar92 = *(int *)(p_Var36 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar80 = *(int *)(p_Var36 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar91 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var36);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_178,&requantize_scales);
          iVar104 = bottom_blob_bordered.c;
          iVar117 = bottom_blob_bordered.w;
          iVar118 = top_blob->w;
          iVar89 = top_blob->h;
          iVar93 = top_blob->c;
          uVar115 = (ulong)iVar93;
          lVar96 = *(long *)(p_Var36 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data);
          lVar105 = *(long *)(&this->field_0x1a8 + (long)p_Var36);
          iVar77 = iVar92 * uVar90;
          iVar95 = bottom_blob_bordered.c * iVar77;
          uVar85 = iVar89 * iVar118;
          Mat::Mat((Mat *)&opt_q,iVar95,uVar85,1,opt->workspace_allocator);
          if ((int)uVar90 < 1) {
            uVar90 = 0;
          }
          if (iVar92 < 1) {
            iVar92 = 0;
          }
          iVar74 = 0;
          if (0 < iVar104) {
            iVar74 = iVar104;
          }
          lVar101 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
          if (iVar118 < 1) {
            iVar118 = 0;
          }
          iVar79 = 0;
          if (iVar89 < 1) {
            iVar89 = 0;
          }
          iVar113 = 0;
          for (iVar114 = 0; iVar114 != iVar89; iVar114 = iVar114 + 1) {
            iVar78 = iVar79;
            for (iVar69 = 0; iVar69 != iVar118; iVar69 = iVar69 + 1) {
              for (iVar76 = 0; iVar76 != iVar74; iVar76 = iVar76 + 1) {
                Mat::channel(&img,&bottom_blob_bordered,iVar76);
                lVar94 = CONCAT44(img.data._4_4_,img.data._0_4_);
                Mat::~Mat(&img);
                iVar70 = iVar78;
                for (iVar84 = 0; iVar84 != iVar92; iVar84 = iVar84 + 1) {
                  for (uVar72 = 0; uVar90 != uVar72; uVar72 = uVar72 + 1) {
                    *(undefined1 *)(iVar113 + lVar101 + uVar72) =
                         *(undefined1 *)(lVar94 + (iVar70 + (int)uVar72));
                  }
                  iVar113 = iVar113 + (int)uVar72;
                  iVar70 = iVar70 + iVar117;
                }
              }
              iVar78 = iVar78 + iVar80;
            }
            iVar79 = iVar79 + iVar91 * iVar117;
          }
          lVar101 = 1;
          Mat::Mat(&img,iVar77 * 4,iVar104,((int)uVar85 / 4) * -3 + uVar85,1,
                   opt->workspace_allocator);
          uVar109 = 0;
          uVar72 = (ulong)(uint)((int)uVar85 >> 2);
          if ((int)uVar85 >> 2 < 1) {
            uVar72 = uVar109;
          }
          for (uVar81 = 0; pAVar61 = opt_q.workspace_allocator, uVar81 != uVar72;
              uVar81 = uVar81 + 1) {
            lVar94 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            lVar88 = (long)(int)opt_q._44_4_;
            Mat::channel(&kernel_tm,&img,(int)uVar81);
            pvVar62 = kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            lVar71 = (long)pAVar61 * local_738 * lVar88 + lVar94;
            lVar83 = (long)pAVar61 * local_710 * lVar88 + lVar94;
            lVar103 = (long)pAVar61 * lVar101 * lVar88 + lVar94;
            lVar94 = (long)pAVar61 * uVar109 * lVar88 + lVar94;
            for (lVar88 = 0; (int)lVar88 + 1 < iVar95; lVar88 = lVar88 + 2) {
              *(undefined1 *)((long)pvVar62 + lVar88 * 4) = *(undefined1 *)(lVar94 + lVar88);
              *(undefined1 *)((long)pvVar62 + lVar88 * 4 + 1) = *(undefined1 *)(lVar94 + 1 + lVar88)
              ;
              *(undefined1 *)((long)pvVar62 + lVar88 * 4 + 2) = *(undefined1 *)(lVar103 + lVar88);
              *(undefined1 *)((long)pvVar62 + lVar88 * 4 + 3) =
                   *(undefined1 *)(lVar103 + 1 + lVar88);
              *(undefined1 *)((long)pvVar62 + lVar88 * 4 + 4) = *(undefined1 *)(lVar71 + lVar88);
              *(undefined1 *)((long)pvVar62 + lVar88 * 4 + 5) = *(undefined1 *)(lVar71 + 1 + lVar88)
              ;
              *(undefined1 *)((long)pvVar62 + lVar88 * 4 + 6) = *(undefined1 *)(lVar83 + lVar88);
              *(undefined1 *)((long)pvVar62 + lVar88 * 4 + 7) = *(undefined1 *)(lVar83 + 1 + lVar88)
              ;
            }
            for (; (int)lVar88 < iVar95; lVar88 = lVar88 + 1) {
              *(undefined1 *)((long)pvVar62 + lVar88 * 4) = *(undefined1 *)(lVar94 + lVar88);
              *(undefined1 *)((long)pvVar62 + lVar88 * 4 + 1) = *(undefined1 *)(lVar103 + lVar88);
              *(undefined1 *)((long)pvVar62 + lVar88 * 4 + 2) = *(undefined1 *)(lVar71 + lVar88);
              *(undefined1 *)((long)pvVar62 + lVar88 * 4 + 3) = *(undefined1 *)(lVar83 + lVar88);
            }
            local_738 = local_738 + 4;
            local_710 = local_710 + 4;
            lVar101 = lVar101 + 4;
            uVar109 = uVar109 + 4;
          }
          for (uVar72 = (ulong)(int)(uVar85 & 0xfffffffc); pAVar61 = opt_q.workspace_allocator,
              (long)uVar72 < (long)(int)uVar85; uVar72 = uVar72 + 1) {
            lVar101 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            lVar94 = (long)(int)opt_q._44_4_;
            uVar109 = (ulong)(uint)((int)uVar72 >> 0x1f) << 0x20 | uVar72 & 0xffffffff;
            Mat::channel(&kernel_tm,&img,(int)((long)uVar109 % 4) + (int)((long)uVar109 / 4));
            pvVar62 = kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            lVar101 = lVar101 + (long)pAVar61 * uVar72 * lVar94;
            for (lVar94 = 0; (int)lVar94 + 1 < iVar95; lVar94 = lVar94 + 2) {
              *(undefined1 *)((long)pvVar62 + lVar94) = *(undefined1 *)(lVar101 + lVar94);
              *(undefined1 *)((long)pvVar62 + lVar94 + 1) = *(undefined1 *)(lVar101 + 1 + lVar94);
            }
            for (; (int)lVar94 < iVar95; lVar94 = lVar94 + 1) {
              *(undefined1 *)((long)pvVar62 + lVar94) = *(undefined1 *)(lVar101 + lVar94);
            }
          }
          Mat::Mat(&kernel_tm,iVar77 * 4,iVar104,iVar93 / 4 + iVar93 % 4,1,opt->workspace_allocator)
          ;
          uVar109 = uVar115 & 0xfffffffffffffffc;
          uVar81 = 0;
          uVar72 = (ulong)(uint)(iVar93 >> 2);
          if (iVar93 >> 2 < 1) {
            uVar72 = uVar81;
          }
          iVar104 = iVar104 * iVar77;
          iVar80 = iVar104 * 4;
          local_728._0_4_ = iVar104 * 2;
          local_6f8._0_4_ = iVar104 * 3;
          iVar92 = iVar95;
          for (uVar86 = 0; uVar86 != uVar72; uVar86 = uVar86 + 1) {
            Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar86);
            uVar127 = sum0._0_8_;
            lVar94 = (int)uVar81 + lVar96;
            lVar71 = iVar92 + lVar96;
            lVar103 = (int)local_728._0_4_ + lVar96;
            lVar83 = (int)local_6f8._0_4_ + lVar96;
            Mat::~Mat((Mat *)sum0);
            for (lVar101 = 0; (int)lVar101 + 1 < iVar95; lVar101 = lVar101 + 2) {
              *(undefined1 *)(uVar127 + lVar101 * 4) = *(undefined1 *)(lVar94 + lVar101);
              *(undefined1 *)(uVar127 + 1 + lVar101 * 4) = *(undefined1 *)(lVar94 + 1 + lVar101);
              *(undefined1 *)(uVar127 + 2 + lVar101 * 4) = *(undefined1 *)(lVar71 + lVar101);
              *(undefined1 *)(uVar127 + 3 + lVar101 * 4) = *(undefined1 *)(lVar71 + 1 + lVar101);
              *(undefined1 *)(uVar127 + 4 + lVar101 * 4) = *(undefined1 *)(lVar103 + lVar101);
              *(undefined1 *)(uVar127 + 5 + lVar101 * 4) = *(undefined1 *)(lVar103 + 1 + lVar101);
              *(undefined1 *)(uVar127 + 6 + lVar101 * 4) = *(undefined1 *)(lVar83 + lVar101);
              *(undefined1 *)(uVar127 + 7 + lVar101 * 4) = *(undefined1 *)(lVar83 + 1 + lVar101);
            }
            for (; (int)lVar101 < iVar95; lVar101 = lVar101 + 1) {
              *(undefined1 *)(uVar127 + lVar101 * 4) = *(undefined1 *)(lVar94 + lVar101);
              *(undefined1 *)(uVar127 + 1 + lVar101 * 4) = *(undefined1 *)(lVar71 + lVar101);
              *(undefined1 *)(uVar127 + 2 + lVar101 * 4) = *(undefined1 *)(lVar103 + lVar101);
              *(undefined1 *)(uVar127 + 3 + lVar101 * 4) = *(undefined1 *)(lVar83 + lVar101);
            }
            uVar81 = (ulong)(uint)((int)uVar81 + iVar80);
            iVar92 = iVar92 + iVar80;
            local_728._0_4_ = local_728._0_4_ + iVar80;
            local_6f8._0_4_ = local_6f8._0_4_ + iVar80;
          }
          iVar92 = iVar104 * ((uint)(uVar115 >> 2) & 0x3fffffff) * 4;
          for (uVar81 = uVar109; (long)uVar81 < (long)uVar115; uVar81 = uVar81 + 1) {
            uVar86 = (ulong)(uint)((int)uVar81 >> 0x1f) << 0x20 | uVar81 & 0xffffffff;
            Mat::channel((Mat *)sum0,&kernel_tm,(int)((long)uVar86 % 4) + (int)((long)uVar86 / 4));
            uVar127 = sum0._0_8_;
            lVar94 = iVar92 + lVar96;
            Mat::~Mat((Mat *)sum0);
            for (lVar101 = 0; (int)lVar101 + 1 < iVar95; lVar101 = lVar101 + 2) {
              *(undefined1 *)(uVar127 + lVar101) = *(undefined1 *)(lVar94 + lVar101);
              *(undefined1 *)(uVar127 + 1 + lVar101) = *(undefined1 *)(lVar94 + 1 + lVar101);
            }
            for (; (int)lVar101 < iVar95; lVar101 = lVar101 + 1) {
              *(undefined1 *)(uVar127 + lVar101) = *(undefined1 *)(lVar94 + lVar101);
            }
            iVar92 = iVar92 + iVar95;
          }
          for (uVar81 = 0; uVar81 != uVar72; uVar81 = uVar81 + 1) {
            uVar86 = uVar81 * 4;
            if (lVar105 == 0) {
              fVar125 = 0.0;
              fVar2 = 0.0;
              fVar124 = 0.0;
              fVar171 = 0.0;
            }
            else {
              fVar124 = *(float *)(lVar105 + uVar81 * 0x10);
              fVar171 = *(float *)(lVar105 + 4 + uVar81 * 0x10);
              fVar2 = *(float *)(lVar105 + 8 + uVar81 * 0x10);
              fVar125 = *(float *)(lVar105 + 0xc + uVar81 * 0x10);
            }
            fVar3 = local_178._M_impl.super__Vector_impl_data._M_start[uVar81 * 4];
            fVar4 = local_178._M_impl.super__Vector_impl_data._M_start[uVar86 | 1];
            fVar5 = local_178._M_impl.super__Vector_impl_data._M_start[uVar86 | 2];
            fVar6 = local_178._M_impl.super__Vector_impl_data._M_start[uVar86 | 3];
            uVar90 = (uint)uVar86;
            Mat::channel((Mat *)sum0,top_blob,uVar90);
            pfVar116 = (float *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            Mat::channel((Mat *)sum0,top_blob,uVar90 | 1);
            pfVar111 = (float *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            Mat::channel((Mat *)sum0,top_blob,uVar90 | 2);
            pfVar106 = (float *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            Mat::channel((Mat *)sum0,top_blob,(int)(uVar86 | 3));
            pfVar87 = (float *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            uVar90 = 0;
            while( true ) {
              if ((int)uVar85 <= (int)(uVar90 | 3)) break;
              Mat::channel((Mat *)sum0,&img,uVar90 >> 2);
              lVar96 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar81);
              pcVar120 = (char *)sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              sum1[0] = 0;
              sum1[1] = 0;
              sum1[2] = 0;
              sum1[3] = 0;
              sum2[0] = 0;
              sum2[1] = 0;
              sum2[2] = 0;
              sum2[3] = 0;
              sum3[0] = 0;
              sum3[1] = 0;
              sum3[2] = 0;
              sum3[3] = 0;
              for (uVar112 = 0; (int)(uVar112 | 1) < iVar95; uVar112 = uVar112 + 2) {
                cVar141 = *pcVar120;
                cVar142 = pcVar120[1];
                cVar143 = pcVar120[2];
                cVar144 = pcVar120[3];
                cVar145 = pcVar120[4];
                cVar146 = pcVar120[5];
                cVar33 = pcVar120[6];
                cVar34 = pcVar120[7];
                for (lVar101 = 0; lVar101 != 8; lVar101 = lVar101 + 2) {
                  iVar92 = (int)*(char *)(lVar96 + lVar101);
                  iVar80 = (int)*(char *)(lVar96 + 1 + lVar101);
                  *(int *)((long)sum0 + lVar101 * 2) =
                       iVar80 * cVar142 + iVar92 * cVar141 + *(int *)((long)sum0 + lVar101 * 2);
                  piVar1 = (int *)((long)sum2 + lVar101 * 2);
                  *piVar1 = *piVar1 + iVar80 * cVar146 + iVar92 * cVar145;
                  *(int *)((long)sum1 + lVar101 * 2) =
                       iVar80 * cVar144 + iVar92 * cVar143 + *(int *)((long)sum1 + lVar101 * 2);
                  piVar1 = (int *)((long)sum3 + lVar101 * 2);
                  *piVar1 = *piVar1 + iVar80 * cVar34 + iVar92 * cVar33;
                }
                pcVar120 = pcVar120 + 8;
                lVar96 = lVar96 + 8;
              }
              for (; (int)uVar112 < iVar95; uVar112 = uVar112 + 1) {
                cVar141 = *pcVar120;
                cVar142 = pcVar120[1];
                cVar143 = pcVar120[2];
                cVar144 = pcVar120[3];
                for (lVar101 = 0; lVar101 != 4; lVar101 = lVar101 + 1) {
                  iVar92 = (int)*(char *)(lVar96 + lVar101);
                  sum0[lVar101] = sum0[lVar101] + iVar92 * cVar141;
                  sum1[lVar101] = sum1[lVar101] + iVar92 * cVar142;
                  sum2[lVar101] = sum2[lVar101] + iVar92 * cVar143;
                  sum3[lVar101] = sum3[lVar101] + iVar92 * cVar144;
                }
                pcVar120 = pcVar120 + 4;
                lVar96 = lVar96 + 4;
              }
              for (lVar96 = 0; lVar96 != 0x10; lVar96 = lVar96 + 4) {
                *(float *)((long)pfVar116 + lVar96) =
                     (float)*(int *)((long)sum0 + lVar96) * fVar3 + fVar124;
                *(float *)((long)pfVar111 + lVar96) =
                     (float)*(int *)((long)sum1 + lVar96) * fVar4 + fVar171;
                *(float *)((long)pfVar106 + lVar96) =
                     (float)*(int *)((long)sum2 + lVar96) * fVar5 + fVar2;
                *(float *)((long)pfVar87 + lVar96) =
                     (float)*(int *)((long)sum3 + lVar96) * fVar6 + fVar125;
              }
              pfVar116 = pfVar116 + 4;
              pfVar111 = pfVar111 + 4;
              pfVar106 = pfVar106 + 4;
              pfVar87 = pfVar87 + 4;
              uVar90 = uVar90 + 4;
            }
            for (; (int)uVar90 < (int)uVar85; uVar90 = uVar90 + 1) {
              Mat::channel((Mat *)sum0,&img,(uVar90 & 3) + (uVar90 >> 2));
              uVar127 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar81);
              uVar150 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              iVar118 = 0;
              iVar91 = 0;
              iVar80 = 0;
              iVar92 = 0;
              pcVar120 = (char *)uVar150;
              for (lVar96 = 0; (int)lVar96 + 1 < iVar95; lVar96 = lVar96 + 2) {
                iVar89 = (int)*(char *)(uVar127 + lVar96);
                iVar93 = (int)*(char *)(uVar127 + 1 + lVar96);
                iVar118 = pcVar120[1] * iVar93 + *pcVar120 * iVar89 + iVar118;
                iVar91 = pcVar120[3] * iVar93 + pcVar120[2] * iVar89 + iVar91;
                iVar80 = pcVar120[5] * iVar93 + pcVar120[4] * iVar89 + iVar80;
                iVar92 = pcVar120[7] * iVar93 + pcVar120[6] * iVar89 + iVar92;
                pcVar120 = pcVar120 + 8;
              }
              for (; (int)lVar96 < iVar95; lVar96 = lVar96 + 1) {
                iVar89 = (int)*(char *)(uVar127 + lVar96);
                iVar118 = iVar118 + *(char *)(uVar150 + lVar96 * 4) * iVar89;
                iVar91 = iVar91 + *(char *)(uVar150 + 1 + lVar96 * 4) * iVar89;
                iVar80 = iVar80 + *(char *)(uVar150 + 2 + lVar96 * 4) * iVar89;
                iVar92 = iVar92 + *(char *)(uVar150 + 3 + lVar96 * 4) * iVar89;
              }
              *pfVar116 = (float)iVar118 * fVar3 + fVar124;
              *pfVar111 = (float)iVar91 * fVar4 + fVar171;
              *pfVar106 = (float)iVar80 * fVar5 + fVar2;
              *pfVar87 = (float)iVar92 * fVar6 + fVar125;
              pfVar116 = pfVar116 + 1;
              pfVar111 = pfVar111 + 1;
              pfVar106 = pfVar106 + 1;
              pfVar87 = pfVar87 + 1;
            }
          }
          iVar92 = 0;
          if (0 < iVar95) {
            iVar92 = iVar95;
          }
          for (; (long)uVar109 < (long)uVar115; uVar109 = uVar109 + 1) {
            iVar80 = (int)uVar109;
            Mat::channel((Mat *)sum0,top_blob,iVar80);
            pfVar116 = (float *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            if (lVar105 == 0) {
              fVar124 = 0.0;
            }
            else {
              fVar124 = *(float *)(lVar105 + uVar109 * 4);
            }
            fVar171 = local_178._M_impl.super__Vector_impl_data._M_start[uVar109];
            iVar80 = (int)((long)((ulong)(uint)(iVar80 >> 0x1f) << 0x20 | uVar109 & 0xffffffff) / 4)
                     * -3 + iVar80;
            for (uVar90 = 0; (int)(uVar90 | 3) < (int)uVar85; uVar90 = uVar90 + 4) {
              Mat::channel((Mat *)sum0,&img,uVar90 >> 2);
              lVar96 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,iVar80);
              pcVar120 = (char *)sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              for (uVar112 = 0; (int)(uVar112 | 1) < iVar95; uVar112 = uVar112 + 2) {
                cVar141 = *pcVar120;
                cVar142 = pcVar120[1];
                for (lVar101 = 0; lVar101 != 4; lVar101 = lVar101 + 1) {
                  sum0[lVar101] =
                       (int)*(char *)(lVar96 + 1 + lVar101 * 2) * (int)cVar142 +
                       (int)*(char *)(lVar96 + lVar101 * 2) * (int)cVar141 + sum0[lVar101];
                }
                pcVar120 = pcVar120 + 2;
                lVar96 = lVar96 + 8;
              }
              for (; (int)uVar112 < iVar95; uVar112 = uVar112 + 1) {
                cVar141 = *pcVar120;
                for (lVar101 = 0; lVar101 != 4; lVar101 = lVar101 + 1) {
                  sum0[lVar101] = sum0[lVar101] + (int)*(char *)(lVar96 + lVar101) * (int)cVar141;
                }
                pcVar120 = pcVar120 + 1;
                lVar96 = lVar96 + 4;
              }
              for (lVar96 = 0; lVar96 != 4; lVar96 = lVar96 + 1) {
                pfVar116[lVar96] = (float)sum0[lVar96] * fVar171 + fVar124;
              }
              pfVar116 = pfVar116 + 4;
            }
            for (; (int)uVar90 < (int)uVar85; uVar90 = uVar90 + 1) {
              Mat::channel((Mat *)sum0,&img,(uVar90 & 3) + (uVar90 >> 2));
              uVar127 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,iVar80);
              uVar150 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              iVar91 = 0;
              for (lVar96 = 0; iVar92 != (int)lVar96; lVar96 = lVar96 + 1) {
                iVar91 = iVar91 + (int)*(char *)(uVar127 + lVar96) *
                                  (int)*(char *)(uVar150 + lVar96);
              }
              *pfVar116 = (float)iVar91 * fVar171 + fVar124;
              pfVar116 = pfVar116 + 1;
            }
          }
          Mat::~Mat(&kernel_tm);
          Mat::~Mat(&img);
          Mat::~Mat((Mat *)&opt_q);
          this_01 = &local_178;
        }
        else {
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          requantize_scales.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          for (lVar96 = 0; p_Var36 = pp_Var73[-3],
              lVar96 < *(int *)(p_Var36 + 0x30 + (long)&(this->weight_data_3x3_winograd63).data);
              lVar96 = lVar96 + 1) {
            fVar124 = *(float *)(*(long *)(&this->field_0x1f0 + (long)p_Var36) + lVar96 * 4);
            opt_q._0_4_ = 0.0;
            if (fVar124 != 0.0) {
              opt_q._0_4_ = 1.0 / (fVar124 * **(float **)(&this->field_0x238 + (long)p_Var36));
            }
            img.data._0_4_ = **(undefined4 **)(&this->field_0x280 + (long)p_Var36);
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict *)&opt_q);
            std::vector<float,_std::allocator<float>_>::push_back
                      (&requantize_scales,(value_type_conflict *)&img);
            pp_Var73 = this->_vptr_Convolution_x86;
          }
          uVar90 = *(uint *)(p_Var36 + 0x34 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar92 = *(int *)(p_Var36 + 0x38 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar80 = *(int *)(p_Var36 + 0x44 + (long)&(this->weight_data_3x3_winograd63).data);
          iVar91 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var36);
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&local_160,&requantize_scales);
          iVar104 = bottom_blob_bordered.c;
          iVar117 = bottom_blob_bordered.w;
          iVar118 = top_blob->w;
          iVar89 = top_blob->h;
          iVar93 = top_blob->c;
          uVar115 = (ulong)iVar93;
          lVar96 = *(long *)(p_Var36 + 0x28 + (long)&(this->weight_data_3x3_winograd23_int8).data);
          lVar105 = *(long *)(&this->field_0x1a8 + (long)p_Var36);
          iVar77 = iVar92 * uVar90;
          iVar95 = bottom_blob_bordered.c * iVar77;
          uVar85 = iVar89 * iVar118;
          Mat::Mat((Mat *)&opt_q,iVar95,uVar85,1,opt->workspace_allocator);
          if ((int)uVar90 < 1) {
            uVar90 = 0;
          }
          if (iVar92 < 1) {
            iVar92 = 0;
          }
          local_6e8[0]._0_4_ = 0;
          if (0 < iVar104) {
            local_6e8[0]._0_4_ = iVar104;
          }
          lVar101 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
          if (iVar118 < 1) {
            iVar118 = 0;
          }
          iVar74 = 0;
          if (iVar89 < 1) {
            iVar89 = 0;
          }
          iVar114 = 0;
          for (iVar79 = 0; iVar79 != iVar89; iVar79 = iVar79 + 1) {
            iVar113 = iVar74;
            for (iVar78 = 0; iVar78 != iVar118; iVar78 = iVar78 + 1) {
              for (iVar69 = 0; iVar69 != local_6e8[0]._0_4_; iVar69 = iVar69 + 1) {
                Mat::channel(&img,&bottom_blob_bordered,iVar69);
                lVar94 = CONCAT44(img.data._4_4_,img.data._0_4_);
                Mat::~Mat(&img);
                iVar76 = iVar113;
                for (iVar70 = 0; iVar70 != iVar92; iVar70 = iVar70 + 1) {
                  for (uVar72 = 0; uVar90 != uVar72; uVar72 = uVar72 + 1) {
                    *(undefined1 *)(iVar114 + lVar101 + uVar72) =
                         *(undefined1 *)(lVar94 + (iVar76 + (int)uVar72));
                  }
                  iVar114 = iVar114 + (int)uVar72;
                  iVar76 = iVar76 + iVar117;
                }
              }
              iVar113 = iVar113 + iVar80;
            }
            iVar74 = iVar74 + iVar91 * iVar117;
          }
          lVar101 = 1;
          Mat::Mat(&img,iVar77 * 4,iVar104,((int)uVar85 / 4) * -3 + uVar85,1,
                   opt->workspace_allocator);
          local_750._0_4_ = uVar85 & 0xfffffffc;
          uVar109 = 0;
          uVar72 = (ulong)(uint)((int)uVar85 >> 2);
          if ((int)uVar85 >> 2 < 1) {
            uVar72 = uVar109;
          }
          lVar94 = 3;
          lVar71 = 2;
          for (uVar81 = 0; pAVar61 = opt_q.workspace_allocator, uVar81 != uVar72;
              uVar81 = uVar81 + 1) {
            local_6e8[0]._0_8_ = lVar71;
            lVar83 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            lVar98 = (long)(int)opt_q._44_4_;
            Mat::channel(&kernel_tm,&img,(int)uVar81);
            pvVar62 = kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            lVar103 = (long)pAVar61 * lVar94 * lVar98 + lVar83;
            lVar88 = (long)pAVar61 * lVar71 * lVar98 + lVar83;
            lVar97 = (long)pAVar61 * lVar101 * lVar98 + lVar83;
            lVar83 = (long)pAVar61 * uVar109 * lVar98 + lVar83;
            for (lVar98 = 0; (int)lVar98 + 1 < iVar95; lVar98 = lVar98 + 2) {
              *(undefined1 *)((long)pvVar62 + lVar98 * 4) = *(undefined1 *)(lVar83 + lVar98);
              *(undefined1 *)((long)pvVar62 + lVar98 * 4 + 1) = *(undefined1 *)(lVar83 + 1 + lVar98)
              ;
              *(undefined1 *)((long)pvVar62 + lVar98 * 4 + 2) = *(undefined1 *)(lVar97 + lVar98);
              *(undefined1 *)((long)pvVar62 + lVar98 * 4 + 3) = *(undefined1 *)(lVar97 + 1 + lVar98)
              ;
              *(undefined1 *)((long)pvVar62 + lVar98 * 4 + 4) = *(undefined1 *)(lVar88 + lVar98);
              *(undefined1 *)((long)pvVar62 + lVar98 * 4 + 5) = *(undefined1 *)(lVar88 + 1 + lVar98)
              ;
              *(undefined1 *)((long)pvVar62 + lVar98 * 4 + 6) = *(undefined1 *)(lVar103 + lVar98);
              *(undefined1 *)((long)pvVar62 + lVar98 * 4 + 7) =
                   *(undefined1 *)(lVar103 + 1 + lVar98);
            }
            for (; (int)lVar98 < iVar95; lVar98 = lVar98 + 1) {
              *(undefined1 *)((long)pvVar62 + lVar98 * 4) = *(undefined1 *)(lVar83 + lVar98);
              *(undefined1 *)((long)pvVar62 + lVar98 * 4 + 1) = *(undefined1 *)(lVar97 + lVar98);
              *(undefined1 *)((long)pvVar62 + lVar98 * 4 + 2) = *(undefined1 *)(lVar88 + lVar98);
              *(undefined1 *)((long)pvVar62 + lVar98 * 4 + 3) = *(undefined1 *)(lVar103 + lVar98);
            }
            lVar94 = lVar94 + 4;
            lVar71 = lVar71 + 4;
            lVar101 = lVar101 + 4;
            uVar109 = uVar109 + 4;
          }
          for (uVar72 = (ulong)(int)(uint)local_750; pAVar61 = opt_q.workspace_allocator,
              (long)uVar72 < (long)(int)uVar85; uVar72 = uVar72 + 1) {
            lVar101 = CONCAT44(opt_q.num_threads,opt_q._0_4_);
            lVar94 = (long)(int)opt_q._44_4_;
            uVar109 = (ulong)(uint)((int)uVar72 >> 0x1f) << 0x20 | uVar72 & 0xffffffff;
            Mat::channel(&kernel_tm,&img,(int)((long)uVar109 % 4) + (int)((long)uVar109 / 4));
            pvVar62 = kernel_tm.data;
            Mat::~Mat(&kernel_tm);
            lVar101 = lVar101 + (long)pAVar61 * uVar72 * lVar94;
            for (lVar94 = 0; (int)lVar94 + 1 < iVar95; lVar94 = lVar94 + 2) {
              *(undefined1 *)((long)pvVar62 + lVar94) = *(undefined1 *)(lVar101 + lVar94);
              *(undefined1 *)((long)pvVar62 + lVar94 + 1) = *(undefined1 *)(lVar101 + 1 + lVar94);
            }
            for (; (int)lVar94 < iVar95; lVar94 = lVar94 + 1) {
              *(undefined1 *)((long)pvVar62 + lVar94) = *(undefined1 *)(lVar101 + lVar94);
            }
          }
          Mat::Mat(&kernel_tm,iVar77 * 4,iVar104,iVar93 / 4 + iVar93 % 4,1,opt->workspace_allocator)
          ;
          uVar109 = uVar115 & 0xfffffffffffffffc;
          uVar81 = 0;
          uVar72 = (ulong)(uint)(iVar93 >> 2);
          if (iVar93 >> 2 < 1) {
            uVar72 = uVar81;
          }
          iVar104 = iVar104 * iVar77;
          iVar80 = iVar104 * 4;
          iVar91 = iVar104 * 2;
          local_728._0_4_ = iVar104 * 3;
          iVar92 = iVar95;
          for (uVar86 = 0; uVar86 != uVar72; uVar86 = uVar86 + 1) {
            Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar86);
            uVar127 = sum0._0_8_;
            local_6e8[0]._0_8_ = uVar81;
            lVar94 = (int)uVar81 + lVar96;
            lVar71 = iVar92 + lVar96;
            lVar103 = iVar91 + lVar96;
            lVar83 = (int)local_728._0_4_ + lVar96;
            Mat::~Mat((Mat *)sum0);
            for (lVar101 = 0; (int)lVar101 + 1 < iVar95; lVar101 = lVar101 + 2) {
              *(undefined1 *)(uVar127 + lVar101 * 4) = *(undefined1 *)(lVar94 + lVar101);
              *(undefined1 *)(uVar127 + 1 + lVar101 * 4) = *(undefined1 *)(lVar94 + 1 + lVar101);
              *(undefined1 *)(uVar127 + 2 + lVar101 * 4) = *(undefined1 *)(lVar71 + lVar101);
              *(undefined1 *)(uVar127 + 3 + lVar101 * 4) = *(undefined1 *)(lVar71 + 1 + lVar101);
              *(undefined1 *)(uVar127 + 4 + lVar101 * 4) = *(undefined1 *)(lVar103 + lVar101);
              *(undefined1 *)(uVar127 + 5 + lVar101 * 4) = *(undefined1 *)(lVar103 + 1 + lVar101);
              *(undefined1 *)(uVar127 + 6 + lVar101 * 4) = *(undefined1 *)(lVar83 + lVar101);
              *(undefined1 *)(uVar127 + 7 + lVar101 * 4) = *(undefined1 *)(lVar83 + 1 + lVar101);
            }
            for (; (int)lVar101 < iVar95; lVar101 = lVar101 + 1) {
              *(undefined1 *)(uVar127 + lVar101 * 4) = *(undefined1 *)(lVar94 + lVar101);
              *(undefined1 *)(uVar127 + 1 + lVar101 * 4) = *(undefined1 *)(lVar71 + lVar101);
              *(undefined1 *)(uVar127 + 2 + lVar101 * 4) = *(undefined1 *)(lVar103 + lVar101);
              *(undefined1 *)(uVar127 + 3 + lVar101 * 4) = *(undefined1 *)(lVar83 + lVar101);
            }
            uVar81 = (ulong)(uint)((int)uVar81 + iVar80);
            iVar92 = iVar92 + iVar80;
            iVar91 = iVar91 + iVar80;
            local_728._0_4_ = local_728._0_4_ + iVar80;
          }
          iVar92 = iVar104 * ((uint)(uVar115 >> 2) & 0x3fffffff) * 4;
          for (uVar81 = uVar109; (long)uVar81 < (long)uVar115; uVar81 = uVar81 + 1) {
            uVar86 = (ulong)(uint)((int)uVar81 >> 0x1f) << 0x20 | uVar81 & 0xffffffff;
            Mat::channel((Mat *)sum0,&kernel_tm,(int)((long)uVar86 % 4) + (int)((long)uVar86 / 4));
            uVar127 = sum0._0_8_;
            lVar94 = iVar92 + lVar96;
            Mat::~Mat((Mat *)sum0);
            for (lVar101 = 0; (int)lVar101 + 1 < iVar95; lVar101 = lVar101 + 2) {
              *(undefined1 *)(uVar127 + lVar101) = *(undefined1 *)(lVar94 + lVar101);
              *(undefined1 *)(uVar127 + 1 + lVar101) = *(undefined1 *)(lVar94 + 1 + lVar101);
            }
            for (; (int)lVar101 < iVar95; lVar101 = lVar101 + 1) {
              *(undefined1 *)(uVar127 + lVar101) = *(undefined1 *)(lVar94 + lVar101);
            }
            iVar92 = iVar92 + iVar95;
          }
          for (uVar81 = 0; uVar81 != uVar72; uVar81 = uVar81 + 1) {
            uVar86 = uVar81 * 4;
            uVar90 = (uint)uVar86;
            Mat::channel((Mat *)sum0,top_blob,uVar90);
            local_6e8[0]._0_4_ = sum0[0];
            local_6e8[0]._4_4_ = sum0[1];
            Mat::~Mat((Mat *)sum0);
            uVar119 = uVar86 | 1;
            Mat::channel((Mat *)sum0,top_blob,uVar90 | 1);
            local_788 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            uVar82 = uVar86 | 2;
            Mat::channel((Mat *)sum0,top_blob,uVar90 | 2);
            local_790 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            uVar86 = uVar86 | 3;
            Mat::channel((Mat *)sum0,top_blob,uVar90 | 3);
            local_750 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            if (lVar105 == 0) {
              fVar125 = 0.0;
              fVar2 = 0.0;
              fVar124 = 0.0;
              fVar171 = 0.0;
            }
            else {
              fVar124 = *(float *)(lVar105 + uVar81 * 0x10);
              fVar171 = *(float *)(lVar105 + uVar119 * 4);
              fVar2 = *(float *)(lVar105 + uVar82 * 4);
              fVar125 = *(float *)(lVar105 + uVar86 * 4);
            }
            fVar3 = local_160._M_impl.super__Vector_impl_data._M_start[uVar81 * 8];
            fVar4 = local_160._M_impl.super__Vector_impl_data._M_start[uVar81 * 8 + 1];
            fVar5 = local_160._M_impl.super__Vector_impl_data._M_start[uVar119 * 2];
            fVar6 = local_160._M_impl.super__Vector_impl_data._M_start[uVar119 * 2 + 1];
            fVar7 = local_160._M_impl.super__Vector_impl_data._M_start[uVar82 * 2];
            fVar8 = local_160._M_impl.super__Vector_impl_data._M_start[uVar82 * 2 + 1];
            fVar9 = local_160._M_impl.super__Vector_impl_data._M_start[uVar86 * 2];
            fVar35 = local_160._M_impl.super__Vector_impl_data._M_start[uVar86 * 2 + 1];
            for (uVar90 = 0; (int)(uVar90 | 3) < (int)uVar85; uVar90 = uVar90 + 4) {
              Mat::channel((Mat *)sum0,&img,uVar90 >> 2);
              lVar96 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar81);
              pcVar120 = (char *)sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              sum1[0] = 0;
              sum1[1] = 0;
              sum1[2] = 0;
              sum1[3] = 0;
              sum2[0] = 0;
              sum2[1] = 0;
              sum2[2] = 0;
              sum2[3] = 0;
              sum3[0] = 0;
              sum3[1] = 0;
              sum3[2] = 0;
              sum3[3] = 0;
              for (uVar112 = 0; (int)(uVar112 | 1) < iVar95; uVar112 = uVar112 + 2) {
                cVar141 = *pcVar120;
                cVar142 = pcVar120[1];
                cVar143 = pcVar120[2];
                cVar144 = pcVar120[3];
                cVar145 = pcVar120[4];
                cVar146 = pcVar120[5];
                cVar33 = pcVar120[6];
                cVar34 = pcVar120[7];
                for (lVar101 = 0; lVar101 != 8; lVar101 = lVar101 + 2) {
                  iVar80 = (int)*(char *)(lVar96 + lVar101);
                  iVar92 = (int)*(char *)(lVar96 + 1 + lVar101);
                  *(int *)((long)sum0 + lVar101 * 2) =
                       iVar92 * cVar142 + iVar80 * cVar141 + *(int *)((long)sum0 + lVar101 * 2);
                  piVar1 = (int *)((long)sum2 + lVar101 * 2);
                  *piVar1 = *piVar1 + iVar92 * cVar146 + iVar80 * cVar145;
                  *(int *)((long)sum1 + lVar101 * 2) =
                       iVar92 * cVar144 + iVar80 * cVar143 + *(int *)((long)sum1 + lVar101 * 2);
                  piVar1 = (int *)((long)sum3 + lVar101 * 2);
                  *piVar1 = *piVar1 + iVar92 * cVar34 + iVar80 * cVar33;
                }
                pcVar120 = pcVar120 + 8;
                lVar96 = lVar96 + 8;
              }
              for (; (int)uVar112 < iVar95; uVar112 = uVar112 + 1) {
                cVar141 = *pcVar120;
                cVar142 = pcVar120[1];
                cVar143 = pcVar120[2];
                cVar144 = pcVar120[3];
                for (lVar101 = 0; lVar101 != 4; lVar101 = lVar101 + 1) {
                  iVar92 = (int)*(char *)(lVar96 + lVar101);
                  sum0[lVar101] = sum0[lVar101] + iVar92 * cVar141;
                  sum1[lVar101] = sum1[lVar101] + iVar92 * cVar142;
                  sum2[lVar101] = sum2[lVar101] + iVar92 * cVar143;
                  sum3[lVar101] = sum3[lVar101] + iVar92 * cVar144;
                }
                pcVar120 = pcVar120 + 4;
                lVar96 = lVar96 + 4;
              }
              for (lVar96 = 0; lVar96 != 4; lVar96 = lVar96 + 1) {
                fVar123 = roundf(((float)sum0[lVar96] * fVar3 + fVar124) * fVar4);
                iVar92 = (int)fVar123;
                if ((int)fVar123 < -0x7e) {
                  iVar92 = -0x7f;
                }
                uVar68 = (undefined1)iVar92;
                if (0x7e < iVar92) {
                  uVar68 = 0x7f;
                }
                *(undefined1 *)(local_6e8[0]._0_8_ + lVar96) = uVar68;
                fVar123 = roundf(((float)sum1[lVar96] * fVar5 + fVar171) * fVar6);
                iVar92 = (int)fVar123;
                if ((int)fVar123 < -0x7e) {
                  iVar92 = -0x7f;
                }
                uVar68 = (undefined1)iVar92;
                if (0x7e < iVar92) {
                  uVar68 = 0x7f;
                }
                local_788[lVar96] = uVar68;
                fVar123 = roundf(((float)sum2[lVar96] * fVar7 + fVar2) * fVar8);
                iVar92 = (int)fVar123;
                if (iVar92 < -0x7e) {
                  iVar92 = -0x7f;
                }
                uVar68 = (undefined1)iVar92;
                if (0x7e < iVar92) {
                  uVar68 = 0x7f;
                }
                local_790[lVar96] = uVar68;
                fVar123 = roundf(((float)sum3[lVar96] * fVar9 + fVar125) * fVar35);
                iVar92 = (int)fVar123;
                if (iVar92 < -0x7e) {
                  iVar92 = -0x7f;
                }
                uVar68 = (undefined1)iVar92;
                if (0x7e < iVar92) {
                  uVar68 = 0x7f;
                }
                local_750[lVar96] = uVar68;
              }
              local_6e8[0]._0_8_ = local_6e8[0]._0_8_ + 4;
              local_788 = local_788 + 4;
              local_790 = local_790 + 4;
              local_750 = local_750 + 4;
            }
            for (; (int)uVar90 < (int)uVar85; uVar90 = uVar90 + 1) {
              Mat::channel((Mat *)sum0,&img,(uVar90 & 3) + (uVar90 >> 2));
              uVar127 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,(int)uVar81);
              uVar150 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              iVar92 = 0;
              iVar118 = 0;
              iVar91 = 0;
              iVar80 = 0;
              pcVar120 = (char *)uVar150;
              for (lVar96 = 0; (int)lVar96 + 1 < iVar95; lVar96 = lVar96 + 2) {
                iVar89 = (int)*(char *)(uVar127 + lVar96);
                iVar93 = (int)*(char *)(uVar127 + 1 + lVar96);
                iVar92 = pcVar120[1] * iVar93 + *pcVar120 * iVar89 + iVar92;
                iVar118 = pcVar120[3] * iVar93 + pcVar120[2] * iVar89 + iVar118;
                iVar91 = pcVar120[5] * iVar93 + pcVar120[4] * iVar89 + iVar91;
                iVar80 = pcVar120[7] * iVar93 + pcVar120[6] * iVar89 + iVar80;
                pcVar120 = pcVar120 + 8;
              }
              for (; (int)lVar96 < iVar95; lVar96 = lVar96 + 1) {
                iVar89 = (int)*(char *)(uVar127 + lVar96);
                iVar92 = iVar92 + *(char *)(uVar150 + lVar96 * 4) * iVar89;
                iVar118 = iVar118 + *(char *)(uVar150 + 1 + lVar96 * 4) * iVar89;
                iVar91 = iVar91 + *(char *)(uVar150 + 2 + lVar96 * 4) * iVar89;
                iVar80 = iVar80 + *(char *)(uVar150 + 3 + lVar96 * 4) * iVar89;
              }
              fVar123 = roundf(((float)iVar92 * fVar3 + fVar124) * fVar4);
              iVar92 = (int)fVar123;
              if ((int)fVar123 < -0x7e) {
                iVar92 = -0x7f;
              }
              uVar68 = (undefined1)iVar92;
              if (0x7e < iVar92) {
                uVar68 = 0x7f;
              }
              *(undefined1 *)local_6e8[0]._0_8_ = uVar68;
              fVar123 = roundf(((float)iVar118 * fVar5 + fVar171) * fVar6);
              iVar92 = (int)fVar123;
              if ((int)fVar123 < -0x7e) {
                iVar92 = -0x7f;
              }
              uVar68 = (undefined1)iVar92;
              if (0x7e < iVar92) {
                uVar68 = 0x7f;
              }
              *local_788 = uVar68;
              fVar123 = roundf(((float)iVar91 * fVar7 + fVar2) * fVar8);
              iVar92 = (int)fVar123;
              if (iVar92 < -0x7e) {
                iVar92 = -0x7f;
              }
              uVar68 = (undefined1)iVar92;
              if (0x7e < iVar92) {
                uVar68 = 0x7f;
              }
              *local_790 = uVar68;
              fVar123 = roundf(((float)iVar80 * fVar9 + fVar125) * fVar35);
              iVar92 = (int)fVar123;
              if (iVar92 < -0x7e) {
                iVar92 = -0x7f;
              }
              uVar68 = (undefined1)iVar92;
              if (0x7e < iVar92) {
                uVar68 = 0x7f;
              }
              *local_750 = uVar68;
              local_6e8[0]._0_8_ = (undefined1 *)(local_6e8[0]._0_8_ + 1);
              local_788 = local_788 + 1;
              local_790 = local_790 + 1;
              local_750 = local_750 + 1;
            }
          }
          iVar92 = 0;
          if (0 < iVar95) {
            iVar92 = iVar95;
          }
          for (; (long)uVar109 < (long)uVar115; uVar109 = uVar109 + 1) {
            iVar80 = (int)uVar109;
            Mat::channel((Mat *)sum0,top_blob,iVar80);
            puVar107 = (undefined1 *)sum0._0_8_;
            Mat::~Mat((Mat *)sum0);
            if (lVar105 == 0) {
              fVar124 = 0.0;
            }
            else {
              fVar124 = *(float *)(lVar105 + uVar109 * 4);
            }
            fVar171 = local_160._M_impl.super__Vector_impl_data._M_start[uVar109 * 2];
            fVar2 = local_160._M_impl.super__Vector_impl_data._M_start[uVar109 * 2 + 1];
            iVar80 = (int)((long)((ulong)(uint)(iVar80 >> 0x1f) << 0x20 | uVar109 & 0xffffffff) / 4)
                     * -3 + iVar80;
            for (uVar90 = 0; (int)(uVar90 | 3) < (int)uVar85; uVar90 = uVar90 + 4) {
              Mat::channel((Mat *)sum0,&img,uVar90 >> 2);
              lVar96 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,iVar80);
              pcVar120 = (char *)sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              sum0[0] = 0;
              sum0[1] = 0;
              sum0[2] = 0;
              sum0[3] = 0;
              for (uVar112 = 0; (int)(uVar112 | 1) < iVar95; uVar112 = uVar112 + 2) {
                cVar141 = *pcVar120;
                cVar142 = pcVar120[1];
                for (lVar101 = 0; lVar101 != 4; lVar101 = lVar101 + 1) {
                  sum0[lVar101] =
                       (int)*(char *)(lVar96 + 1 + lVar101 * 2) * (int)cVar142 +
                       (int)*(char *)(lVar96 + lVar101 * 2) * (int)cVar141 + sum0[lVar101];
                }
                pcVar120 = pcVar120 + 2;
                lVar96 = lVar96 + 8;
              }
              for (; (int)uVar112 < iVar95; uVar112 = uVar112 + 1) {
                cVar141 = *pcVar120;
                for (lVar101 = 0; lVar101 != 4; lVar101 = lVar101 + 1) {
                  sum0[lVar101] = sum0[lVar101] + (int)*(char *)(lVar96 + lVar101) * (int)cVar141;
                }
                pcVar120 = pcVar120 + 1;
                lVar96 = lVar96 + 4;
              }
              for (lVar96 = 0; lVar96 != 4; lVar96 = lVar96 + 1) {
                fVar125 = roundf(((float)sum0[lVar96] * fVar171 + fVar124) * fVar2);
                iVar91 = (int)fVar125;
                if (iVar91 < -0x7e) {
                  iVar91 = -0x7f;
                }
                if (0x7e < iVar91) {
                  iVar91 = 0x7f;
                }
                puVar107[lVar96] = (char)iVar91;
              }
              puVar107 = puVar107 + 4;
            }
            for (; (int)uVar90 < (int)uVar85; uVar90 = uVar90 + 1) {
              Mat::channel((Mat *)sum0,&img,(uVar90 & 3) + (uVar90 >> 2));
              uVar127 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              Mat::channel((Mat *)sum0,&kernel_tm,iVar80);
              uVar150 = sum0._0_8_;
              Mat::~Mat((Mat *)sum0);
              iVar91 = 0;
              for (lVar96 = 0; iVar92 != (int)lVar96; lVar96 = lVar96 + 1) {
                iVar91 = iVar91 + (int)*(char *)(uVar127 + lVar96) *
                                  (int)*(char *)(uVar150 + lVar96);
              }
              fVar125 = roundf(((float)iVar91 * fVar171 + fVar124) * fVar2);
              iVar91 = (int)fVar125;
              if (iVar91 < -0x7e) {
                iVar91 = -0x7f;
              }
              uVar68 = (undefined1)iVar91;
              if (0x7e < iVar91) {
                uVar68 = 0x7f;
              }
              *puVar107 = uVar68;
              puVar107 = puVar107 + 1;
            }
          }
          Mat::~Mat(&kernel_tm);
          Mat::~Mat(&img);
          Mat::~Mat((Mat *)&opt_q);
          this_01 = &local_160;
        }
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(this_01);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  (&requantize_scales.super__Vector_base<float,_std::allocator<float>_>);
        pLVar37 = this->activation;
        if (pLVar37 != (Layer *)0x0) {
          (*pLVar37->_vptr_Layer[9])(pLVar37,top_blob,opt);
          iVar92 = 0;
          goto LAB_001667d3;
        }
      }
      iVar92 = 0;
    }
  }
LAB_001667d3:
  Mat::~Mat(&top_blob_int32);
LAB_001667e0:
  Mat::~Mat(&bottom_blob_bordered);
  Mat::~Mat(&bottom_blob_int8);
  return iVar92;
}

Assistant:

int Convolution_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack, (size_t)(4u * out_elempack), out_elempack, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

        Mat scale_in_data(num_output);
        for (int p = 0; p < num_output; p++)
        {
            // requantize and relu
            float scale_in;
            if (weight_data_int8_scales[p] == 0)
                scale_in = 0;
            else
                scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

            scale_in_data[p] = scale_in;
        }

        if (use_int8_requantize)
        {
            requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
        }
        else
        {
            dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        if (opt.use_winograd_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);
            //             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_3x3_winograd23_int8, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
        else if (opt.use_sgemm_convolution && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
        {
            if (use_int8_requantize)
            {
                std::vector<float> requantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    float scale_out = top_blob_int8_scales[0];

                    requantize_scales.push_back(scale_in);
                    requantize_scales.push_back(scale_out);
                }

                conv_im2col_sgemm_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, requantize_scales, opt);
            }
            else
            {
                std::vector<float> dequantize_scales;
                for (int p = 0; p < num_output; p++)
                {
                    float scale_in;
                    if (weight_data_int8_scales[p] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                    dequantize_scales.push_back(scale_in);
                }

                conv_im2col_sgemm_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, dequantize_scales, opt);
            }

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }
        }
        else
        {
            //         convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_int8, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);

            Mat scale_in_data(num_output);
            for (int p = 0; p < num_output; p++)
            {
                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                scale_in_data[p] = scale_in;
            }

            if (use_int8_requantize)
            {
                requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
            }
            else
            {
                dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
        }
    }

    return 0;
}